

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_read_legacy_binary(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *__needle;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  undefined1 *__n;
  undefined1 *__s1;
  undefined1 *puVar12;
  void *__s2;
  undefined1 *puVar13;
  int *piVar14;
  double *pdVar15;
  long *plVar16;
  undefined8 extraout_RAX;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  int *piVar20;
  char *pcVar21;
  ulong uVar22;
  ulong uVar23;
  undefined **ppuVar24;
  char *pcVar25;
  long lVar26;
  undefined **ppuVar27;
  char *pcVar28;
  char *unaff_R15;
  int *piVar29;
  double dVar30;
  int extraout_XMM0_Db;
  uint32_t len;
  bson_subtype_t subtype;
  uint8_t *binary;
  bson_t b;
  bson_error_t error;
  code **ppcVar31;
  undefined4 uStack_53dc;
  undefined8 uStack_53d8;
  undefined2 uStack_53d0;
  int iStack_53c8;
  int iStack_53c4;
  char acStack_53c0 [504];
  code *pcStack_51c8;
  undefined1 auStack_51b8 [512];
  char *pcStack_4fb8;
  code *pcStack_4fb0;
  int iStack_4fa0;
  int iStack_4f9c;
  char acStack_4f98 [504];
  long *plStack_4da0;
  double *pdStack_4d98;
  char *pcStack_4d90;
  code *pcStack_4d88;
  long lStack_4d10;
  long lStack_4d08;
  undefined1 auStack_4d00 [128];
  undefined1 auStack_4c80 [232];
  undefined1 auStack_4b98 [608];
  long *plStack_4938;
  code *pcStack_4930;
  undefined1 auStack_4928 [8];
  char acStack_4920 [16];
  char *pcStack_4910;
  code *pcStack_4908;
  uint uStack_4884;
  undefined8 uStack_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 uStack_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined8 uStack_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 uStack_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  undefined1 auStack_47b8 [648];
  int *piStack_4530;
  double *pdStack_4528;
  undefined **ppuStack_4520;
  int *piStack_4518;
  int *piStack_4510;
  code *pcStack_4508;
  undefined1 auStack_4500 [240];
  undefined1 auStack_4410 [648];
  code *apcStack_4188 [16];
  double dStack_4108;
  int aiStack_4100 [50];
  int iStack_4038;
  int iStack_4034;
  int aiStack_4030 [160];
  int *piStack_3db0;
  double *pdStack_3da8;
  undefined **ppuStack_3da0;
  int *piStack_3d98;
  int *piStack_3d90;
  code *apcStack_3d88 [16];
  double dStack_3d08;
  int aiStack_3d00 [50];
  int iStack_3c38;
  int iStack_3c34;
  int aiStack_3c30 [160];
  undefined8 uStack_39b0;
  undefined1 *puStack_39a8;
  char *pcStack_39a0;
  char *pcStack_3998;
  undefined **ppuStack_3990;
  code *pcStack_3988;
  int iStack_3980;
  int iStack_397c;
  char acStack_3978 [504];
  undefined1 auStack_3780 [336];
  char *pcStack_3630;
  undefined1 *puStack_3628;
  undefined1 *puStack_3620;
  void *pvStack_3618;
  void *pvStack_3610;
  code *pcStack_3608;
  undefined1 auStack_3600 [128];
  char acStack_3580 [232];
  undefined1 auStack_3498 [648];
  char *pcStack_3210;
  code *pcStack_3208;
  undefined1 auStack_3200 [128];
  char acStack_3180 [224];
  int iStack_30a0;
  int iStack_309c;
  char acStack_3098 [640];
  char *pcStack_2e18;
  void *pvStack_2e10;
  code *pcStack_2e08;
  undefined1 auStack_2e00 [128];
  char acStack_2d80 [232];
  undefined1 auStack_2c98 [648];
  char *pcStack_2a10;
  code *pcStack_2a08;
  undefined1 auStack_2a00 [232];
  int iStack_2918;
  int iStack_2914;
  char acStack_2910 [640];
  char *pcStack_2690;
  code *apcStack_2688 [16];
  uint uStack_2604;
  undefined1 auStack_2600 [4];
  uint uStack_25fc;
  undefined1 auStack_2538 [648];
  undefined1 *puStack_22b0;
  undefined1 *puStack_22a8;
  undefined1 *puStack_22a0;
  void *pvStack_2298;
  void *pvStack_2290;
  code *apcStack_2288 [2];
  void *pvStack_2278;
  char *pcStack_2270;
  void *pvStack_2268;
  char *pcStack_2260;
  void *pvStack_2258;
  char *pcStack_2250;
  undefined1 *puStack_2248;
  char *pcStack_2240;
  undefined1 *puStack_2238;
  char *pcStack_2230;
  undefined8 uStack_2228;
  char *pcStack_2220;
  undefined8 uStack_2218;
  char *pcStack_2210;
  undefined8 uStack_2208;
  undefined1 auStack_2200 [4];
  uint uStack_21fc;
  undefined1 auStack_2138 [592];
  undefined8 uStack_1ee8;
  char *pcStack_1ee0;
  char *pcStack_1ed8;
  char *pcStack_1ed0;
  char *pcStack_1ec8;
  char *pcStack_1ec0;
  char *pcStack_1eb8;
  char *pcStack_1eb0;
  char *pcStack_1ea8;
  char *pcStack_1ea0;
  char *pcStack_1e98;
  char *pcStack_1e90;
  code *apcStack_1e88 [7];
  void *pvStack_1e50;
  undefined8 uStack_1e48;
  char *pcStack_1e40;
  void *pvStack_1e38;
  char *pcStack_1e30;
  undefined8 uStack_1e28;
  char *pcStack_1e20;
  void *pvStack_1e18;
  char *pcStack_1e10;
  undefined8 uStack_1e08;
  char acStack_1e00 [4];
  uint uStack_1dfc;
  undefined1 auStack_1d38 [648];
  undefined **ppuStack_1ab0;
  char *pcStack_1aa8;
  long lStack_1aa0;
  undefined1 *puStack_1a98;
  undefined1 *puStack_1a90;
  code *pcStack_1a88;
  int iStack_1a80;
  int iStack_1a7c;
  char acStack_1a78 [504];
  undefined1 auStack_1880 [168];
  undefined8 uStack_17d8;
  long lStack_17d0;
  undefined8 uStack_17c8;
  undefined8 uStack_17c0;
  char *pcStack_17b8;
  char *pcStack_17b0;
  char *pcStack_17a8;
  char *pcStack_17a0;
  char *pcStack_1798;
  long lStack_1790;
  undefined8 uStack_1788;
  char *pcStack_1780;
  char *pcStack_1778;
  char *pcStack_1770;
  char *pcStack_1768;
  long lStack_1760;
  char *pcStack_1758;
  char *pcStack_1750;
  char *pcStack_1748;
  char *pcStack_1740;
  char *pcStack_1738;
  char *pcStack_1730;
  char *pcStack_1728;
  char *pcStack_1720;
  char *pcStack_1718;
  char *pcStack_1710;
  code *apcStack_1708 [12];
  char *pcStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 uStack_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 uStack_1640;
  undefined8 uStack_1638;
  char *apcStack_1630 [22];
  char acStack_1580 [4];
  uint uStack_157c;
  undefined1 auStack_14b8 [648];
  char *pcStack_1230;
  undefined **ppuStack_1228;
  char **ppcStack_1220;
  char *pcStack_1218;
  char *pcStack_1210;
  code *pcStack_1208;
  undefined1 auStack_1200 [128];
  undefined1 auStack_1180 [240];
  undefined1 auStack_1090 [648];
  code *pcStack_e08;
  undefined1 auStack_e00 [128];
  char acStack_d80 [232];
  int iStack_c98;
  int iStack_c94;
  char acStack_c90 [632];
  char *pcStack_a18;
  code *apcStack_a10 [2];
  int iStack_a00;
  int iStack_9fc;
  undefined8 uStack_828;
  char *pcStack_820;
  undefined8 uStack_818;
  int *piStack_810;
  code *pcStack_808;
  int iStack_784;
  char acStack_780 [184];
  undefined8 uStack_6c8;
  char *pcStack_6c0;
  char acStack_6b4 [12];
  undefined1 auStack_6a8 [648];
  char *pcStack_420;
  char *pcStack_418;
  int *piStack_410;
  code *apcStack_408 [15];
  int local_390;
  int local_38c;
  char *local_388;
  char local_380 [200];
  undefined1 local_2b8 [648];
  
  pcVar21 = "{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}";
  ppuVar24 = &PTR_anon_var_dwarf_1a81d_00161258;
  pcVar28 = "foo";
  while( true ) {
    apcStack_408[0] = (code *)0x1305ab;
    cVar1 = bson_init_from_json(local_380,pcVar21,0xffffffffffffffff,local_2b8);
    if (cVar1 == '\0') break;
    apcStack_408[0] = (code *)0x1305b8;
    uVar5 = bson_bcone_magic();
    apcStack_408[0] = (code *)0x0;
    piStack_410 = &local_390;
    pcStack_418 = (char *)0x1305e2;
    bcon_extract(local_380,"x",uVar5,4,&local_38c,&local_388);
    if (local_38c != 5) {
LAB_0013063e:
      apcStack_408[0] = (code *)0x130643;
      test_bson_json_read_legacy_binary_cold_2();
      break;
    }
    if (local_390 != 3) {
      apcStack_408[0] = (code *)0x13063e;
      test_bson_json_read_legacy_binary_cold_3();
      goto LAB_0013063e;
    }
    unaff_R15 = local_388;
    if (local_388 != "foo") {
      apcStack_408[0] = (code *)0x13060d;
      iVar2 = strcmp(local_388,"foo");
      if (iVar2 == 0) goto LAB_00130611;
      goto LAB_00130650;
    }
LAB_00130611:
    apcStack_408[0] = (code *)0x130619;
    bson_destroy(local_380);
    pcVar21 = *ppuVar24;
    ppuVar24 = ppuVar24 + 1;
    if (pcVar21 == (char *)0x0) {
      return;
    }
  }
  apcStack_408[0] = (code *)0x130650;
  test_bson_json_read_legacy_binary_cold_1();
LAB_00130650:
  apcStack_408[0] = test_json_reader_new_from_file;
  test_bson_json_read_legacy_binary_cold_4();
  pcStack_418 = "foo";
  acStack_780[0x70] = '\0';
  acStack_780[0x71] = '\0';
  acStack_780[0x72] = '\0';
  acStack_780[0x73] = '\0';
  acStack_780[0x74] = '\0';
  acStack_780[0x75] = '\0';
  acStack_780[0x76] = '\0';
  acStack_780[0x77] = '\0';
  acStack_780[0x78] = '\0';
  acStack_780[0x79] = '\0';
  acStack_780[0x7a] = '\0';
  acStack_780[0x7b] = '\0';
  acStack_780[0x7c] = '\0';
  acStack_780[0x7d] = '\0';
  acStack_780[0x7e] = '\0';
  acStack_780[0x7f] = '\0';
  acStack_780[0x60] = '\0';
  acStack_780[0x61] = '\0';
  acStack_780[0x62] = '\0';
  acStack_780[99] = '\0';
  acStack_780[100] = '\0';
  acStack_780[0x65] = '\0';
  acStack_780[0x66] = '\0';
  acStack_780[0x67] = '\0';
  acStack_780[0x68] = '\0';
  acStack_780[0x69] = '\0';
  acStack_780[0x6a] = '\0';
  acStack_780[0x6b] = '\0';
  acStack_780[0x6c] = '\0';
  acStack_780[0x6d] = '\0';
  acStack_780[0x6e] = '\0';
  acStack_780[0x6f] = '\0';
  acStack_780[0x50] = '\0';
  acStack_780[0x51] = '\0';
  acStack_780[0x52] = '\0';
  acStack_780[0x53] = '\0';
  acStack_780[0x54] = '\0';
  acStack_780[0x55] = '\0';
  acStack_780[0x56] = '\0';
  acStack_780[0x57] = '\0';
  acStack_780[0x58] = '\0';
  acStack_780[0x59] = '\0';
  acStack_780[0x5a] = '\0';
  acStack_780[0x5b] = '\0';
  acStack_780[0x5c] = '\0';
  acStack_780[0x5d] = '\0';
  acStack_780[0x5e] = '\0';
  acStack_780[0x5f] = '\0';
  acStack_780[0x40] = '\0';
  acStack_780[0x41] = '\0';
  acStack_780[0x42] = '\0';
  acStack_780[0x43] = '\0';
  acStack_780[0x44] = '\0';
  acStack_780[0x45] = '\0';
  acStack_780[0x46] = '\0';
  acStack_780[0x47] = '\0';
  acStack_780[0x48] = '\0';
  acStack_780[0x49] = '\0';
  acStack_780[0x4a] = '\0';
  acStack_780[0x4b] = '\0';
  acStack_780[0x4c] = '\0';
  acStack_780[0x4d] = '\0';
  acStack_780[0x4e] = '\0';
  acStack_780[0x4f] = '\0';
  acStack_780[0x30] = '\0';
  acStack_780[0x31] = '\0';
  acStack_780[0x32] = '\0';
  acStack_780[0x33] = '\0';
  acStack_780[0x34] = '\0';
  acStack_780[0x35] = '\0';
  acStack_780[0x36] = '\0';
  acStack_780[0x37] = '\0';
  acStack_780[0x38] = '\0';
  acStack_780[0x39] = '\0';
  acStack_780[0x3a] = '\0';
  acStack_780[0x3b] = '\0';
  acStack_780[0x3c] = '\0';
  acStack_780[0x3d] = '\0';
  acStack_780[0x3e] = '\0';
  acStack_780[0x3f] = '\0';
  acStack_780[0x20] = '\0';
  acStack_780[0x21] = '\0';
  acStack_780[0x22] = '\0';
  acStack_780[0x23] = '\0';
  acStack_780[0x24] = '\0';
  acStack_780[0x25] = '\0';
  acStack_780[0x26] = '\0';
  acStack_780[0x27] = '\0';
  acStack_780[0x28] = '\0';
  acStack_780[0x29] = '\0';
  acStack_780[0x2a] = '\0';
  acStack_780[0x2b] = '\0';
  acStack_780[0x2c] = '\0';
  acStack_780[0x2d] = '\0';
  acStack_780[0x2e] = '\0';
  acStack_780[0x2f] = '\0';
  acStack_780[0x10] = '\0';
  acStack_780[0x11] = '\0';
  acStack_780[0x12] = '\0';
  acStack_780[0x13] = '\0';
  acStack_780[0x14] = '\0';
  acStack_780[0x15] = '\0';
  acStack_780[0x16] = '\0';
  acStack_780[0x17] = '\0';
  acStack_780[0x18] = '\0';
  acStack_780[0x19] = '\0';
  acStack_780[0x1a] = '\0';
  acStack_780[0x1b] = '\0';
  acStack_780[0x1c] = '\0';
  acStack_780[0x1d] = '\0';
  acStack_780[0x1e] = '\0';
  acStack_780[0x1f] = '\0';
  acStack_780[0] = '\x03';
  acStack_780[1] = '\0';
  acStack_780[2] = '\0';
  acStack_780[3] = '\0';
  acStack_780[4] = '\x05';
  acStack_780[5] = '\0';
  acStack_780[6] = '\0';
  acStack_780[7] = '\0';
  acStack_780[8] = '\x05';
  acStack_780[9] = '\0';
  acStack_780[10] = '\0';
  acStack_780[0xb] = '\0';
  acStack_780[0xc] = '\0';
  acStack_780[0xd] = '\0';
  acStack_780[0xe] = '\0';
  acStack_780[0xf] = '\0';
  pcStack_808 = (code *)0x1306dd;
  pcStack_420 = local_380;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  pcVar21 = (char *)bson_json_reader_new_from_file
                              ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/test.json"
                               ,auStack_6a8);
  if (pcVar21 == (char *)0x0) {
    pcStack_808 = (code *)0x130826;
    test_json_reader_new_from_file_cold_6();
    pcVar21 = local_380;
LAB_00130826:
    pcStack_808 = (code *)0x13082b;
    test_json_reader_new_from_file_cold_5();
LAB_0013082b:
    pcStack_808 = (code *)0x130843;
    test_json_reader_new_from_file_cold_1();
LAB_00130843:
    pcStack_808 = (code *)0x130848;
    test_json_reader_new_from_file_cold_3();
LAB_00130848:
    pcStack_808 = (code *)0x130860;
    test_json_reader_new_from_file_cold_4();
  }
  else {
    pcStack_808 = (code *)0x130701;
    iVar2 = bson_json_reader_read(pcVar21,acStack_780,auStack_6a8);
    if (iVar2 != 1) goto LAB_0013082b;
    pcStack_808 = (code *)0x13070f;
    pcVar28 = (char *)bson_bcone_magic();
    piStack_810 = &iStack_784;
    pcStack_808 = (code *)0x0;
    uStack_818 = 0xf;
    uStack_828 = 0x13074c;
    pcStack_820 = pcVar28;
    bcon_extract(acStack_780,"foo",pcVar28,0,&pcStack_6c0,"a");
    unaff_R15 = pcStack_6c0;
    if (pcStack_6c0 == "bar") {
LAB_00130776:
      if (iStack_784 != 1) goto LAB_00130843;
      unaff_R15 = acStack_780;
      pcStack_808 = (code *)0x130793;
      bson_reinit(unaff_R15);
      pcStack_808 = (code *)0x1307a6;
      iVar2 = bson_json_reader_read(pcVar21,unaff_R15,auStack_6a8);
      if (iVar2 == 1) {
        unaff_R15 = (char *)&uStack_6c8;
        pcStack_808 = (code *)0x1307db;
        bcon_extract(acStack_780,"_id",pcVar28,6,unaff_R15,0);
        pcVar28 = acStack_6b4;
        pcStack_808 = (code *)0x1307f2;
        bson_oid_init_from_string(pcVar28,"aabbccddeeff001122334455");
        pcStack_808 = (code *)0x1307fd;
        cVar1 = bson_oid_equal(pcVar28,uStack_6c8);
        if (cVar1 != '\0') {
          pcStack_808 = (code *)0x13080e;
          bson_destroy(acStack_780);
          pcStack_808 = (code *)0x130816;
          bson_json_reader_destroy(pcVar21);
          return;
        }
        goto LAB_00130826;
      }
      goto LAB_00130848;
    }
    pcStack_808 = (code *)0x13076e;
    iVar2 = strcmp("bar",pcStack_6c0);
    if (iVar2 == 0) goto LAB_00130776;
  }
  pcStack_808 = test_json_reader_new_from_bad_path;
  test_json_reader_new_from_file_cold_2();
  apcStack_a10[0] = (code *)0x130880;
  lVar6 = bson_json_reader_new_from_file
                    ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/does-not-exist"
                     ,&iStack_a00);
  if (lVar6 == 0) {
    if (iStack_a00 != 2) goto LAB_001308a4;
    if (iStack_9fc == 1) {
      return;
    }
  }
  else {
    apcStack_a10[0] = (code *)0x1308a4;
    test_json_reader_new_from_bad_path_cold_1();
LAB_001308a4:
    apcStack_a10[0] = (code *)0x1308a9;
    test_json_reader_new_from_bad_path_cold_2();
  }
  apcStack_a10[0] = test_bson_json_number_long;
  test_json_reader_new_from_bad_path_cold_3();
  pcStack_e08 = (code *)0x1308e1;
  pcStack_a18 = pcVar21;
  apcStack_a10[0] = (code *)apcStack_408;
  cVar1 = bson_init_from_json(acStack_d80,"{\"key\": {\"$numberLong\": \"4611686018427387904\"}}",
                              0xffffffffffffffff,&iStack_c98);
  if (cVar1 == '\0') {
LAB_00130c76:
    pcStack_e08 = (code *)0x130c83;
    test_bson_json_number_long_cold_1();
LAB_00130c83:
    pcStack_e08 = (code *)0x130c90;
    test_bson_json_number_long_cold_6();
LAB_00130c90:
    pcStack_e08 = (code *)0x130c98;
    test_bson_json_number_long_cold_9();
LAB_00130c98:
    pcStack_e08 = (code *)0x130ca5;
    test_bson_json_number_long_cold_10();
LAB_00130ca5:
    pcStack_e08 = (code *)0x130cad;
    test_bson_json_number_long_cold_13();
LAB_00130cad:
    pcStack_e08 = (code *)0x130cb2;
    test_bson_json_number_long_cold_14();
LAB_00130cb2:
    pcStack_e08 = (code *)0x130cb7;
    test_bson_json_number_long_cold_15();
LAB_00130cb7:
    pcStack_e08 = (code *)0x130cbf;
    test_bson_json_number_long_cold_28();
LAB_00130cbf:
    pcStack_e08 = (code *)0x130cc4;
    test_bson_json_number_long_cold_16();
LAB_00130cc4:
    pcStack_e08 = (code *)0x130cc9;
    test_bson_json_number_long_cold_17();
LAB_00130cc9:
    pcStack_e08 = (code *)0x130cd1;
    test_bson_json_number_long_cold_26();
LAB_00130cd1:
    pcStack_e08 = (code *)0x130cd6;
    test_bson_json_number_long_cold_18();
LAB_00130cd6:
    pcStack_e08 = (code *)0x130cdb;
    test_bson_json_number_long_cold_19();
LAB_00130cdb:
    pcStack_e08 = (code *)0x130ce3;
    test_bson_json_number_long_cold_24();
LAB_00130ce3:
    pcStack_e08 = (code *)0x130ce8;
    test_bson_json_number_long_cold_20();
LAB_00130ce8:
    pcStack_e08 = (code *)0x130ced;
    test_bson_json_number_long_cold_21();
  }
  else {
    pcStack_e08 = (code *)0x1308f9;
    cVar1 = bson_iter_init(auStack_e00,acStack_d80);
    if (cVar1 == '\0') {
      pcStack_e08 = (code *)0x130c35;
      test_bson_json_number_long_cold_2();
LAB_00130c35:
      pcStack_e08 = (code *)0x130c3a;
      test_bson_json_number_long_cold_3();
LAB_00130c3a:
      pcStack_e08 = (code *)0x130c3f;
      test_bson_json_number_long_cold_4();
LAB_00130c3f:
      pcStack_e08 = (code *)0x130c44;
      test_bson_json_number_long_cold_5();
LAB_00130c44:
      pcStack_e08 = (code *)0x130c49;
      test_bson_json_number_long_cold_31();
LAB_00130c49:
      pcStack_e08 = (code *)0x130c4e;
      test_bson_json_number_long_cold_30();
LAB_00130c4e:
      pcStack_e08 = (code *)0x130c53;
      test_bson_json_number_long_cold_7();
LAB_00130c53:
      pcStack_e08 = (code *)0x130c58;
      test_bson_json_number_long_cold_8();
LAB_00130c58:
      pcStack_e08 = (code *)0x130c5d;
      test_bson_json_number_long_cold_11();
LAB_00130c5d:
      pcStack_e08 = (code *)0x130c62;
      test_bson_json_number_long_cold_12();
LAB_00130c62:
      pcStack_e08 = (code *)0x130c67;
      test_bson_json_number_long_cold_29();
LAB_00130c67:
      pcStack_e08 = (code *)0x130c6c;
      test_bson_json_number_long_cold_27();
LAB_00130c6c:
      pcStack_e08 = (code *)0x130c71;
      test_bson_json_number_long_cold_25();
LAB_00130c71:
      pcStack_e08 = (code *)0x130c76;
      test_bson_json_number_long_cold_23();
      goto LAB_00130c76;
    }
    pcStack_e08 = (code *)0x130910;
    cVar1 = bson_iter_find(auStack_e00,"key");
    if (cVar1 == '\0') goto LAB_00130c35;
    pcStack_e08 = (code *)0x130920;
    iVar2 = bson_iter_type(auStack_e00);
    if (iVar2 != 0x12) goto LAB_00130c3a;
    pcStack_e08 = (code *)0x130931;
    lVar6 = bson_iter_int64(auStack_e00);
    if (lVar6 != 0x4000000000000000) goto LAB_00130c3f;
    pcVar21 = acStack_d80;
    pcStack_e08 = (code *)0x130954;
    bson_destroy(pcVar21);
    pcStack_e08 = (code *)0x130972;
    cVar1 = bson_init_from_json(pcVar21,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 != '\0') goto LAB_00130c44;
    pcStack_e08 = (code *)0x13099d;
    cVar1 = bson_init_from_json(acStack_d80,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 != '\0') goto LAB_00130c49;
    pcStack_e08 = (code *)0x1309c8;
    cVar1 = bson_init_from_json(acStack_d80,"{\"x\": {\"$numberLong\": \"9223372036854775807\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 == '\0') goto LAB_00130c83;
    pcStack_e08 = (code *)0x1309e7;
    cVar1 = bson_iter_init_find(auStack_e00,acStack_d80,"x");
    if (cVar1 == '\0') goto LAB_00130c4e;
    pcStack_e08 = (code *)0x1309f7;
    iVar2 = bson_iter_type(auStack_e00);
    if (iVar2 != 0x12) goto LAB_00130c53;
    pcVar21 = (char *)0x7fffffffffffffff;
    pcStack_e08 = (code *)0x130a12;
    lVar6 = bson_iter_int64(auStack_e00);
    if (lVar6 != 0x7fffffffffffffff) goto LAB_00130c90;
    pcStack_e08 = (code *)0x130a3e;
    cVar1 = bson_init_from_json(acStack_d80,"{\"x\": {\"$numberLong\": \"-9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 == '\0') goto LAB_00130c98;
    pcStack_e08 = (code *)0x130a5d;
    cVar1 = bson_iter_init_find(auStack_e00,acStack_d80,"x");
    if (cVar1 == '\0') goto LAB_00130c58;
    pcStack_e08 = (code *)0x130a6d;
    iVar2 = bson_iter_type(auStack_e00);
    if (iVar2 != 0x12) goto LAB_00130c5d;
    pcStack_e08 = (code *)0x130a7e;
    lVar6 = bson_iter_int64(auStack_e00);
    pcVar21 = (char *)0x8000000000000000;
    if (lVar6 != -0x8000000000000000) goto LAB_00130ca5;
    pcVar21 = acStack_d80;
    pcStack_e08 = (code *)0x130a9a;
    bson_destroy(pcVar21);
    pcStack_e08 = (code *)0x130ab8;
    cVar1 = bson_init_from_json(pcVar21,"{\"x\": {\"$numberLong\": \"9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 != '\0') goto LAB_00130c62;
    if (iStack_c98 != 1) goto LAB_00130cad;
    if (iStack_c94 != 2) goto LAB_00130cb2;
    pcVar21 = acStack_c90;
    pcStack_e08 = (code *)0x130af7;
    pcVar7 = strstr(pcVar21,"Number \"9223372036854775808\" is out of range");
    if (pcVar7 == (char *)0x0) goto LAB_00130cb7;
    pcStack_e08 = (code *)0x130b23;
    cVar1 = bson_init_from_json(acStack_d80,"{\"x\": {\"$numberLong\": \"-9223372036854775809\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 != '\0') goto LAB_00130c67;
    if (iStack_c98 != 1) goto LAB_00130cbf;
    if (iStack_c94 != 2) goto LAB_00130cc4;
    pcStack_e08 = (code *)0x130b5a;
    pcVar7 = strstr(pcVar21,"Number \"-9223372036854775809\" is out of range");
    if (pcVar7 == (char *)0x0) goto LAB_00130cc9;
    pcStack_e08 = (code *)0x130b86;
    cVar1 = bson_init_from_json(acStack_d80,"{\"x\": {\"$numberLong\": \"10000000000000000000\"}}",
                                0xffffffffffffffff,&iStack_c98);
    if (cVar1 != '\0') goto LAB_00130c6c;
    if (iStack_c98 != 1) goto LAB_00130cd1;
    if (iStack_c94 != 2) goto LAB_00130cd6;
    pcStack_e08 = (code *)0x130bbd;
    pcVar7 = strstr(pcVar21,"Number \"10000000000000000000\" is out of range");
    if (pcVar7 == (char *)0x0) goto LAB_00130cdb;
    pcStack_e08 = (code *)0x130be9;
    cVar1 = bson_init_from_json(acStack_d80,"{\"x\": -10000000000000000000}",0xffffffffffffffff,
                                &iStack_c98);
    if (cVar1 != '\0') goto LAB_00130c71;
    if (iStack_c98 != 1) goto LAB_00130ce3;
    if (iStack_c94 != 2) goto LAB_00130ce8;
    pcStack_e08 = (code *)0x130c20;
    pcVar7 = strstr(pcVar21,"Number \"-10000000000000000000\" is out of range");
    if (pcVar7 != (char *)0x0) {
      return;
    }
  }
  pcStack_e08 = test_bson_json_number_long_zero;
  test_bson_json_number_long_cold_22();
  pcStack_1208 = (code *)0x130d27;
  pcStack_e08 = (code *)apcStack_a10;
  cVar1 = bson_init_from_json(auStack_1180,"{ \"key\": { \"$numberLong\": \"0\" }}",
                              0xffffffffffffffff,auStack_1090);
  if (cVar1 != '\0') {
    pcStack_1208 = (code *)0x130d3b;
    cVar1 = bson_iter_init(auStack_1200,auStack_1180);
    if (cVar1 == '\0') {
      pcStack_1208 = (code *)0x130d83;
      test_bson_json_number_long_zero_cold_2();
LAB_00130d83:
      pcStack_1208 = (code *)0x130d88;
      test_bson_json_number_long_zero_cold_3();
LAB_00130d88:
      pcStack_1208 = (code *)0x130d8d;
      test_bson_json_number_long_zero_cold_4();
    }
    else {
      pcStack_1208 = (code *)0x130d4e;
      cVar1 = bson_iter_find(auStack_1200,"key");
      if (cVar1 == '\0') goto LAB_00130d83;
      pcStack_1208 = (code *)0x130d5a;
      iVar2 = bson_iter_type(auStack_1200);
      if (iVar2 != 0x12) goto LAB_00130d88;
      pcStack_1208 = (code *)0x130d67;
      lVar6 = bson_iter_int64(auStack_1200);
      if (lVar6 == 0) {
        pcStack_1208 = (code *)0x130d79;
        bson_destroy(auStack_1180);
        return;
      }
    }
    pcStack_1208 = (code *)0x130d92;
    test_bson_json_number_long_zero_cold_5();
  }
  pcStack_1208 = test_bson_json_code;
  test_bson_json_number_long_zero_cold_1();
  apcStack_1708[0] = (code *)0x130dbc;
  pcStack_1230 = pcVar21;
  ppuStack_1228 = ppuVar24;
  ppcStack_1220 = &local_388;
  pcStack_1218 = pcVar28;
  pcStack_1210 = unaff_R15;
  pcStack_1208 = (code *)&pcStack_e08;
  lVar6 = bson_bcon_magic();
  apcStack_1708[0] = (code *)0x130de7;
  pcStack_16a8 = (char *)bcon_new(0,"a",lVar6,0xc,"b",0);
  apcStack_1708[0] = (code *)0x130e0a;
  uStack_1638 = bcon_new(0,"a",lVar6,0xc,"b",0);
  apcStack_1708[0] = (code *)0x130e33;
  uVar5 = bcon_new(0,"var",lVar6,0xf,1,0);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x130e59;
  uStack_1640 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
  apcStack_1708[0] = (code *)0x130e86;
  uVar8 = bcon_new(0,"var2",lVar6,0x11,2,0);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x130eac;
  uStack_1648 = bcon_new(0,"a",lVar6,0xe,"b",uVar8);
  apcStack_1708[0] = (code *)0x0;
  pcStack_1718 = "d";
  pcStack_1720 = (char *)0xe;
  pcStack_1730 = "c";
  pcStack_1738 = (char *)0x130ef6;
  pcStack_1728 = (char *)lVar6;
  pcStack_1710 = (char *)uVar8;
  uStack_1680 = uVar8;
  uStack_1650 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = "}";
  pcStack_1720 = "}";
  pcStack_1728 = "value2";
  pcStack_1730 = (char *)0x0;
  pcStack_1740 = "key2";
  pcStack_1748 = "{";
  pcStack_1750 = "subdoc";
  pcStack_1758 = "value";
  lStack_1760 = 0;
  pcStack_1770 = "key1";
  pcStack_1778 = "{";
  pcStack_1780 = "c";
  uStack_1788 = 0x130f7a;
  pcStack_1768 = (char *)lVar6;
  pcStack_1738 = (char *)lVar6;
  uStack_1658 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x130fbe;
  uStack_1678 = uVar5;
  uStack_1660 = bcon_new(0,"a",lVar6,0xe,"b",uVar5);
  apcStack_1708[0] = (code *)0x130fe7;
  uStack_1688 = bcon_new(0,"var","{","}",0);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x13100f;
  uStack_1668 = bcon_new(0,"a",lVar6,0xe,"b",uStack_1688);
  apcStack_1708[0] = (code *)0x0;
  pcStack_1710 = "}";
  pcStack_1718 = "}";
  pcStack_1720 = (char *)0x3;
  pcStack_1728 = (char *)0xf;
  pcStack_1738 = "z";
  pcStack_1740 = "{";
  pcStack_1748 = "d3";
  pcStack_1750 = (char *)0x1;
  pcStack_1758 = (char *)0xf;
  pcStack_1768 = "x";
  pcStack_1770 = "{";
  pcStack_1778 = "d2";
  pcStack_1780 = (char *)0x1;
  uStack_1788 = 0x11;
  pcStack_1798 = "n";
  pcStack_17a0 = "}";
  pcStack_17a8 = "{";
  pcStack_17b0 = "d";
  pcStack_17b8 = "]";
  uStack_17c0 = 2;
  uStack_17c8 = 0xf;
  uStack_17d8 = 0x1310bd;
  lStack_17d0 = lVar6;
  lStack_1790 = lVar6;
  lStack_1760 = lVar6;
  pcStack_1730 = (char *)lVar6;
  uStack_1690 = bcon_new(0,"arr","[",lVar6,0xf,1);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x1310f6;
  uStack_1670 = bcon_new(0,"a",lVar6,0xe,"b",uStack_1690);
  apcStack_1708[0] = (code *)0x131107;
  uStack_1698 = bson_new();
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x13112f;
  pcVar21 = (char *)bcon_new(0,"a",lVar6,0xe,"b",uStack_1698);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = "}";
  pcStack_1720 = "c";
  pcStack_1728 = (char *)0x131172;
  uStack_16a0 = bcon_new(0,"x","{","$code",lVar6,0);
  pcStack_1710 = (char *)0x0;
  pcStack_1718 = (char *)0x131197;
  apcStack_1630[0x15] = (char *)bcon_new(0,"a",lVar6,0xe,"b",uStack_16a0);
  apcStack_1630[0] = "{\"a\": {\"$code\": \"b\"}}";
  apcStack_1630[1] = pcStack_16a8;
  apcStack_1630[2] = "{\"a\": {\"$code\": \"b\\u0000c\\u0000\"}}";
  apcStack_1630[3] = (char *)uStack_1638;
  apcStack_1630[4] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}}";
  apcStack_1630[5] = (char *)uStack_1640;
  apcStack_1630[6] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}";
  apcStack_1630[7] = (char *)uStack_1648;
  apcStack_1630[8] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"key1\": \"value\",          \"subdoc\": {\"key2\": \"value2\"}}}"
  ;
  apcStack_1630[9] = (char *)uStack_1658;
  apcStack_1630[10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"$code\": \"d\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}"
  ;
  apcStack_1630[0xb] = (char *)uStack_1650;
  apcStack_1630[0xc] = "{\"a\": {\"$scope\": {\"var\": 1},          \"$code\": \"b\"}}";
  apcStack_1630[0xd] = (char *)uStack_1660;
  apcStack_1630[0xe] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": {}}}}";
  apcStack_1630[0xf] = (char *)uStack_1668;
  apcStack_1630[0x10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"arr\": [1, 2], \"d\": {},                      \"n\": {\"$numberLong\": \"1\"},                      \"d2\": {\"x\": 1, \"d3\": {\"z\": 3}}}}}"
  ;
  apcStack_1630[0x11] = (char *)uStack_1670;
  apcStack_1630[0x12] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {}}}";
  apcStack_1630[0x13] = pcVar21;
  apcStack_1630[0x14] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"x\": {\"$code\": \"c\"}}}}";
  pcVar25 = (char *)0x8;
  pcVar28 = acStack_1580;
  pcVar7 = "b";
  while( true ) {
    apcStack_1708[0] = (code *)0x13130a;
    cVar1 = bson_init_from_json(pcVar28,*(undefined8 *)((long)&uStack_1638 + (long)pcVar25),
                                0xffffffffffffffff,auStack_14b8);
    __needle = pcVar25;
    if (cVar1 == '\0') break;
    apcStack_1708[0] = (code *)0x13131d;
    pcStack_16a8 = (char *)bson_get_data(pcVar28);
    lVar6 = *(long *)((long)apcStack_1630 + (long)pcVar25);
    apcStack_1708[0] = (code *)0x131332;
    __needle = (char *)bson_get_data(lVar6);
    if (*(uint *)(lVar6 + 4) != uStack_157c) {
LAB_001313fc:
      apcStack_1708[0] = (code *)0x13140e;
      pcVar28 = (char *)bson_as_canonical_extended_json(acStack_1580);
      apcStack_1708[0] = (code *)0x13141b;
      uVar5 = bson_as_canonical_extended_json(lVar6);
      pcVar21 = pcStack_16a8;
      uVar19 = 0xffffffff;
      if (uStack_157c == 0) goto LAB_00131463;
      uVar22 = 0;
      goto LAB_00131448;
    }
    apcStack_1708[0] = (code *)0x13134e;
    pvVar9 = (void *)bson_get_data(lVar6);
    apcStack_1708[0] = (code *)0x131359;
    pvVar10 = (void *)bson_get_data(pcVar28);
    apcStack_1708[0] = (code *)0x131368;
    iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(lVar6 + 4));
    if (iVar2 != 0) goto LAB_001313fc;
    apcStack_1708[0] = (code *)0x13137b;
    bson_destroy(pcVar28);
    pcVar25 = pcVar25 + 0x10;
    pcVar7 = pcVar28;
    pcVar21 = __needle;
    if (pcVar25 == (char *)0xb8) {
      lVar6 = 8;
      do {
        apcStack_1708[0] = (code *)0x13139e;
        bson_destroy(*(undefined8 *)((long)apcStack_1630 + lVar6));
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0xb8);
      apcStack_1708[0] = (code *)0x1313b8;
      bson_destroy(uStack_1678);
      apcStack_1708[0] = (code *)0x1313c5;
      bson_destroy(uStack_1680);
      apcStack_1708[0] = (code *)0x1313cf;
      bson_destroy(uStack_1688);
      apcStack_1708[0] = (code *)0x1313d9;
      bson_destroy(uStack_1690);
      apcStack_1708[0] = (code *)0x1313e3;
      bson_destroy(uStack_16a0);
      apcStack_1708[0] = (code *)0x1313ed;
      bson_destroy(uStack_1698);
      return;
    }
  }
  goto LAB_00131529;
  while( true ) {
    if (pcStack_16a8[uVar22] != __needle[uVar22]) {
      uVar19 = uVar22 & 0xffffffff;
      break;
    }
    uVar22 = uVar22 + 1;
    if (uStack_157c == (uint)uVar22) break;
LAB_00131448:
    if (*(int *)(lVar6 + 4) == (int)uVar22) break;
  }
LAB_00131463:
  if ((int)uVar19 == -1) {
    uVar3 = uStack_157c;
    if (uStack_157c < *(uint *)(lVar6 + 4)) {
      uVar3 = *(uint *)(lVar6 + 4);
    }
    uVar19 = (ulong)(uVar3 - 1);
  }
  apcStack_1708[0] = (code *)0x131494;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,pcVar28,uVar5);
  apcStack_1708[0] = (code *)0x1314ac;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar7 = (char *)(ulong)uVar3;
  apcStack_1708[0] = (code *)0x1314c6;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pcStack_16a8 = (char *)CONCAT44(pcStack_16a8._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131515:
    apcStack_1708[0] = (code *)0x13151a;
    test_bson_json_code_cold_6();
LAB_0013151a:
    apcStack_1708[0] = (code *)0x13151f;
    test_bson_json_code_cold_5();
LAB_0013151f:
    apcStack_1708[0] = (code *)0x131524;
    test_bson_json_code_cold_2();
  }
  else {
    pcVar28 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013151a;
    pcVar7 = (char *)(ulong)uStack_157c;
    apcStack_1708[0] = (code *)0x1314ed;
    pcVar25 = (char *)write(uVar3,pcVar21,(size_t)pcVar7);
    if (pcVar25 != pcVar7) goto LAB_0013151f;
    pcVar7 = (char *)(ulong)*(uint *)(lVar6 + 4);
    apcStack_1708[0] = (code *)0x131504;
    pcVar25 = (char *)write(uVar4,__needle,(size_t)pcVar7);
    if (pcVar25 == pcVar7) {
      apcStack_1708[0] = (code *)0x131515;
      test_bson_json_code_cold_4();
      goto LAB_00131515;
    }
  }
  apcStack_1708[0] = (code *)0x131529;
  test_bson_json_code_cold_3();
LAB_00131529:
  apcStack_1708[0] = test_bson_json_code_errors;
  test_bson_json_code_cold_1();
  lVar26 = 8;
  pcStack_1730 = pcVar7;
  pcStack_1728 = __needle;
  pcStack_1720 = pcVar21;
  pcStack_1718 = pcVar28;
  pcStack_1710 = (char *)lVar6;
  apcStack_1708[0] = (code *)&pcStack_1208;
  do {
    pcStack_1a88 = (code *)0x13157d;
    cVar1 = bson_init_from_json(auStack_1880,*(undefined8 *)(&UNK_00161268 + lVar26),
                                0xffffffffffffffff,&iStack_1a80);
    if (cVar1 != '\0') {
      pcStack_1a88 = (code *)0x1315ca;
      test_bson_json_code_errors_cold_3();
LAB_001315ca:
      pcStack_1a88 = (code *)0x1315cf;
      test_bson_json_code_errors_cold_2();
LAB_001315cf:
      pcStack_1a88 = (code *)0x1315ef;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_1a78,
              __needle);
      pcStack_1a88 = (code *)0x1315f4;
      abort();
    }
    if (iStack_1a80 != 1) {
      pcStack_1a88 = test_bson_json_dbref;
      test_bson_json_code_errors_cold_1();
      ppuStack_1ab0 = &PTR_anon_var_dwarf_1ab4d_00161270;
      apcStack_1e88[0] = (code *)0x131616;
      pcStack_1aa8 = __needle;
      lStack_1aa0 = lVar26;
      puStack_1a98 = auStack_1880;
      puStack_1a90 = (undefined1 *)&iStack_1a80;
      pcStack_1a88 = (code *)apcStack_1708;
      uVar5 = bson_bcon_magic();
      if (oid_zero_initialized == '\0') {
        apcStack_1e88[0] = (code *)0x131635;
        bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
        oid_zero_initialized = '\x01';
      }
      pvVar10 = (void *)0x0;
      pcVar21 = "$ref";
      pcStack_1e90 = (char *)0x0;
      pcStack_1e98 = "}";
      pcStack_1ea0 = oid_zero_oid;
      pcStack_1ea8 = (char *)0x6;
      pcStack_1eb8 = "$id";
      pcStack_1ec0 = "collection";
      pcStack_1ec8 = (char *)0x131696;
      pcStack_1eb0 = (char *)uVar5;
      pvStack_1e50 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_1e90 = (char *)0x0;
      pcStack_1e98 = "}";
      pcStack_1ea0 = (char *)0x1;
      pcStack_1ea8 = (char *)0xf;
      pcStack_1eb8 = "$id";
      pcStack_1ec0 = "collection";
      pcStack_1ec8 = (char *)0x1316e6;
      pcStack_1eb0 = (char *)uVar5;
      uStack_1e48 = bcon_new(0,"key","{","$ref",uVar5,0);
      apcStack_1e88[0] = (code *)0x0;
      pcStack_1e90 = "}";
      pcStack_1e98 = "}";
      pcStack_1ea0 = (char *)0x1;
      pcStack_1ea8 = (char *)0xf;
      pcStack_1eb8 = "a";
      pcStack_1ec0 = "{";
      pcStack_1ec8 = "$id";
      pcStack_1ed0 = "collection";
      pcStack_1ed8 = (char *)0x13173e;
      pcStack_1eb0 = (char *)uVar5;
      pvVar9 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_1e90 = (char *)0x0;
      pcStack_1e98 = "}";
      pcStack_1ea0 = (char *)0x1;
      pcStack_1ea8 = (char *)0x7;
      pcStack_1eb8 = "meta";
      pcStack_1ec0 = (char *)0x1;
      pcStack_1ec8 = (char *)0xf;
      pcStack_1ed8 = "$id";
      pcStack_1ee0 = "collection";
      uStack_1ee8 = 0x1317a1;
      pcStack_1ed0 = (char *)uVar5;
      pcStack_1eb0 = (char *)uVar5;
      uStack_1e08 = bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_1e40 = 
      "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
      pvStack_1e38 = pvStack_1e50;
      pcStack_1e30 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
      uStack_1e28 = uStack_1e48;
      pcStack_1e20 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
      pvStack_1e18 = pvVar9;
      pcStack_1e10 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
      pcVar28 = "key";
      break;
    }
    if (iStack_1a7c != 2) goto LAB_001315ca;
    __needle = *(char **)((long)&PTR_anon_var_dwarf_1ab4d_00161270 + lVar26);
    pcStack_1a88 = (code *)0x1315a4;
    pcVar28 = strstr(acStack_1a78,__needle);
    if (pcVar28 == (char *)0x0) goto LAB_001315cf;
    lVar26 = lVar26 + 0x10;
    if (lVar26 == 0x98) {
      return;
    }
  } while( true );
LAB_001317fb:
  apcStack_1e88[0] = (code *)0x131817;
  cVar1 = bson_init_from_json(acStack_1e00,*(undefined8 *)((long)&pcStack_1e40 + (long)pvVar10),
                              0xffffffffffffffff,auStack_1d38);
  pcVar7 = acStack_1e00;
  pvVar11 = pvVar10;
  if (cVar1 == '\0') goto LAB_001319dd;
  apcStack_1e88[0] = (code *)0x13182a;
  pvStack_1e50 = (void *)bson_get_data(acStack_1e00);
  pcVar7 = *(char **)((long)&pvStack_1e38 + (long)pvVar10);
  apcStack_1e88[0] = (code *)0x13183c;
  pvVar11 = (void *)bson_get_data(pcVar7);
  if (*(uint *)(pcVar7 + 4) != uStack_1dfc) {
LAB_001318b1:
    apcStack_1e88[0] = (code *)0x1318c3;
    pcVar21 = (char *)bson_as_canonical_extended_json(acStack_1e00);
    apcStack_1e88[0] = (code *)0x1318d0;
    uVar5 = bson_as_canonical_extended_json(pcVar7);
    pvVar9 = pvStack_1e50;
    uVar19 = 0xffffffff;
    if (uStack_1dfc == 0) goto LAB_00131915;
    uVar22 = 0;
    goto LAB_001318fb;
  }
  apcStack_1e88[0] = (code *)0x131853;
  pcVar21 = (char *)bson_get_data(pcVar7);
  apcStack_1e88[0] = (code *)0x13185e;
  pvVar9 = (void *)bson_get_data(acStack_1e00);
  apcStack_1e88[0] = (code *)0x13186c;
  iVar2 = bcmp(pcVar21,pvVar9,(ulong)*(uint *)(pcVar7 + 4));
  if (iVar2 != 0) goto LAB_001318b1;
  apcStack_1e88[0] = (code *)0x13187b;
  bson_destroy(acStack_1e00);
  pvVar10 = (void *)((long)pvVar10 + 0x10);
  pcVar28 = acStack_1e00;
  pvVar9 = pvVar11;
  if (pvVar10 == (void *)0x40) {
    lVar6 = 8;
    do {
      apcStack_1e88[0] = (code *)0x131898;
      bson_destroy(*(undefined8 *)((long)&pcStack_1e40 + lVar6));
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x48);
    return;
  }
  goto LAB_001317fb;
  while( true ) {
    if (*(char *)((long)pvStack_1e50 + uVar22) != *(char *)((long)pvVar11 + uVar22)) {
      uVar19 = uVar22 & 0xffffffff;
      break;
    }
    uVar22 = uVar22 + 1;
    if (uStack_1dfc == (uint)uVar22) break;
LAB_001318fb:
    if (*(int *)(pcVar7 + 4) == (int)uVar22) break;
  }
LAB_00131915:
  if ((int)uVar19 == -1) {
    uVar3 = uStack_1dfc;
    if (uStack_1dfc < *(uint *)(pcVar7 + 4)) {
      uVar3 = *(uint *)(pcVar7 + 4);
    }
    uVar19 = (ulong)(uVar3 - 1);
  }
  apcStack_1e88[0] = (code *)0x131945;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,pcVar21,uVar5);
  apcStack_1e88[0] = (code *)0x13195d;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar28 = (char *)(ulong)uVar3;
  apcStack_1e88[0] = (code *)0x131978;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_1e50 = (void *)CONCAT44(pvStack_1e50._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_001319c9:
    apcStack_1e88[0] = (code *)0x1319ce;
    test_bson_json_dbref_cold_6();
LAB_001319ce:
    apcStack_1e88[0] = (code *)0x1319d3;
    test_bson_json_dbref_cold_5();
LAB_001319d3:
    apcStack_1e88[0] = (code *)0x1319d8;
    test_bson_json_dbref_cold_2();
  }
  else {
    pcVar21 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_001319ce;
    pcVar28 = (char *)(ulong)uStack_1dfc;
    apcStack_1e88[0] = (code *)0x1319a2;
    pcVar25 = (char *)write(uVar3,pvVar9,(size_t)pcVar28);
    if (pcVar25 != pcVar28) goto LAB_001319d3;
    pcVar7 = (char *)(ulong)*(uint *)(pcVar7 + 4);
    apcStack_1e88[0] = (code *)0x1319b8;
    pcVar25 = (char *)write(uVar4,pvVar11,(size_t)pcVar7);
    if (pcVar25 == pcVar7) {
      apcStack_1e88[0] = (code *)0x1319c9;
      test_bson_json_dbref_cold_4();
      goto LAB_001319c9;
    }
  }
  apcStack_1e88[0] = (code *)0x1319dd;
  test_bson_json_dbref_cold_3();
LAB_001319dd:
  apcStack_1e88[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  apcStack_2288[0] = (code *)0x131a07;
  pcStack_1eb0 = pcVar7;
  pcStack_1ea8 = pcVar28;
  pcStack_1ea0 = pcVar21;
  pcStack_1e98 = (char *)pvVar11;
  pcStack_1e90 = (char *)pvVar9;
  apcStack_1e88[0] = (code *)&pcStack_1a88;
  uVar5 = bson_bcon_magic();
  apcStack_2288[0] = (code *)0x131a29;
  pvStack_2278 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_49b7 + 0xc,0);
  apcStack_2288[0] = (code *)0x131a4d;
  pvVar9 = (void *)bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  apcStack_2288[0] = (code *)0x131a6f;
  __n = (undefined1 *)bcon_new(0,"quote",uVar5,0,"\"",0);
  apcStack_2288[0] = (code *)0x131a91;
  __s1 = (undefined1 *)bcon_new(0,"backslash",uVar5,0,"\\",0);
  apcStack_2288[0] = (code *)0x131aaf;
  uVar8 = bcon_new(0,"",uVar5,0,"",0);
  apcStack_2288[0] = (code *)0x131ad1;
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  apcStack_2288[0] = (code *)0x131ad9;
  uStack_2208 = bson_new();
  pcStack_2270 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_2268 = pvStack_2278;
  pcStack_2260 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_2250 = "{ \"quote\": \"\\\"\"}";
  pcStack_2240 = "{ \"backslash\": \"\\\\\"}";
  pcStack_2230 = "{ \"\": \"\"}";
  pcStack_2220 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_2210 = "{ \"nil\": \"\\u0000\"}";
  apcStack_2288[0] = (code *)0x131b76;
  pvStack_2258 = pvVar9;
  puStack_2248 = __n;
  puStack_2238 = __s1;
  uStack_2228 = uVar8;
  uStack_2218 = uVar5;
  bson_append_utf8(uStack_2208,"nil",0xffffffff,"",1);
  pvVar10 = (void *)0x8;
  while( true ) {
    apcStack_2288[0] = (code *)0x131ba0;
    cVar1 = bson_init_from_json(auStack_2200,*(undefined8 *)((long)&pvStack_2278 + (long)pvVar10),
                                0xffffffffffffffff,auStack_2138);
    puVar13 = auStack_2200;
    pvVar11 = pvVar10;
    if (cVar1 == '\0') break;
    apcStack_2288[0] = (code *)0x131bb3;
    pvStack_2278 = (void *)bson_get_data(auStack_2200);
    puVar13 = *(undefined1 **)((long)&pcStack_2270 + (long)pvVar10);
    apcStack_2288[0] = (code *)0x131bc5;
    pvVar11 = (void *)bson_get_data(puVar13);
    if (*(uint *)(puVar13 + 4) != uStack_21fc) {
LAB_00131c3a:
      apcStack_2288[0] = (code *)0x131c4c;
      __s1 = (undefined1 *)bson_as_canonical_extended_json(auStack_2200);
      apcStack_2288[0] = (code *)0x131c59;
      uVar5 = bson_as_canonical_extended_json(puVar13);
      pvVar9 = pvStack_2278;
      uVar19 = 0xffffffff;
      if (uStack_21fc == 0) goto LAB_00131c9e;
      uVar22 = 0;
      goto LAB_00131c84;
    }
    apcStack_2288[0] = (code *)0x131bdc;
    __s1 = (undefined1 *)bson_get_data(puVar13);
    apcStack_2288[0] = (code *)0x131be7;
    pvVar9 = (void *)bson_get_data(auStack_2200);
    apcStack_2288[0] = (code *)0x131bf5;
    iVar2 = bcmp(__s1,pvVar9,(ulong)*(uint *)(puVar13 + 4));
    if (iVar2 != 0) goto LAB_00131c3a;
    apcStack_2288[0] = (code *)0x131c04;
    bson_destroy(auStack_2200);
    pvVar10 = (void *)((long)pvVar10 + 0x10);
    __n = auStack_2200;
    pvVar9 = pvVar11;
    if (pvVar10 == (void *)0x78) {
      lVar6 = 8;
      do {
        apcStack_2288[0] = (code *)0x131c21;
        bson_destroy(*(undefined8 *)((long)&pcStack_2270 + lVar6));
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x78);
      return;
    }
  }
  goto LAB_00131d66;
  while( true ) {
    if (*(char *)((long)pvStack_2278 + uVar22) != *(char *)((long)pvVar11 + uVar22)) {
      uVar19 = uVar22 & 0xffffffff;
      break;
    }
    uVar22 = uVar22 + 1;
    if (uStack_21fc == (uint)uVar22) break;
LAB_00131c84:
    if (*(int *)(puVar13 + 4) == (int)uVar22) break;
  }
LAB_00131c9e:
  if ((int)uVar19 == -1) {
    uVar3 = uStack_21fc;
    if (uStack_21fc < *(uint *)(puVar13 + 4)) {
      uVar3 = *(uint *)(puVar13 + 4);
    }
    uVar19 = (ulong)(uVar3 - 1);
  }
  apcStack_2288[0] = (code *)0x131cce;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,__s1,uVar5);
  apcStack_2288[0] = (code *)0x131ce6;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  __n = (undefined1 *)(ulong)uVar3;
  apcStack_2288[0] = (code *)0x131d01;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_2278 = (void *)CONCAT44(pvStack_2278._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131d52:
    apcStack_2288[0] = (code *)0x131d57;
    test_bson_json_uescape_cold_6();
LAB_00131d57:
    apcStack_2288[0] = (code *)0x131d5c;
    test_bson_json_uescape_cold_5();
LAB_00131d5c:
    apcStack_2288[0] = (code *)0x131d61;
    test_bson_json_uescape_cold_2();
  }
  else {
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131d57;
    __n = (undefined1 *)(ulong)uStack_21fc;
    apcStack_2288[0] = (code *)0x131d2b;
    puVar12 = (undefined1 *)write(uVar3,pvVar9,(size_t)__n);
    if (puVar12 != __n) goto LAB_00131d5c;
    puVar13 = (undefined1 *)(ulong)*(uint *)(puVar13 + 4);
    apcStack_2288[0] = (code *)0x131d41;
    puVar12 = (undefined1 *)write(uVar4,pvVar11,(size_t)puVar13);
    if (puVar12 == puVar13) {
      apcStack_2288[0] = (code *)0x131d52;
      test_bson_json_uescape_cold_4();
      goto LAB_00131d52;
    }
  }
  apcStack_2288[0] = (code *)0x131d66;
  test_bson_json_uescape_cold_3();
LAB_00131d66:
  apcStack_2288[0] = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_2688[0] = (code *)0x131d90;
  puStack_22b0 = puVar13;
  puStack_22a8 = __n;
  puStack_22a0 = __s1;
  pvStack_2298 = pvVar11;
  pvStack_2290 = pvVar9;
  apcStack_2288[0] = (code *)apcStack_1e88;
  uVar5 = bson_bcon_magic();
  apcStack_2688[0] = (code *)0x131daf;
  pcVar28 = (char *)bcon_new(0,anon_var_dwarf_49b7 + 0xc,uVar5,0,"euro",0);
  apcStack_2688[0] = (code *)0x131dd5;
  cVar1 = bson_init_from_json(auStack_2600,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,
                              auStack_2538);
  if (cVar1 == '\0') {
LAB_00131f51:
    apcStack_2688[0] = (code *)0x131f56;
    test_bson_json_uescape_key_cold_1();
LAB_00131f56:
    apcStack_2688[0] = (code *)0x131f5b;
    test_bson_json_uescape_key_cold_6();
LAB_00131f5b:
    apcStack_2688[0] = (code *)0x131f60;
    test_bson_json_uescape_key_cold_5();
LAB_00131f60:
    apcStack_2688[0] = (code *)0x131f65;
    test_bson_json_uescape_key_cold_2();
  }
  else {
    apcStack_2688[0] = (code *)0x131ded;
    pvVar9 = (void *)bson_get_data(auStack_2600);
    apcStack_2688[0] = (code *)0x131df8;
    pvVar11 = (void *)bson_get_data(pcVar28);
    if (*(uint *)(pcVar28 + 4) == uStack_25fc) {
      apcStack_2688[0] = (code *)0x131e0d;
      pvVar10 = (void *)bson_get_data(pcVar28);
      apcStack_2688[0] = (code *)0x131e1d;
      __s2 = (void *)bson_get_data(auStack_2600);
      apcStack_2688[0] = (code *)0x131e2b;
      iVar2 = bcmp(pvVar10,__s2,(ulong)*(uint *)(pcVar28 + 4));
      if (iVar2 == 0) {
        apcStack_2688[0] = (code *)0x131e3c;
        bson_destroy(auStack_2600);
        apcStack_2688[0] = (code *)0x131e44;
        bson_destroy(pcVar28);
        return;
      }
    }
    __s1 = auStack_2600;
    apcStack_2688[0] = (code *)0x131e65;
    uVar5 = bson_as_canonical_extended_json(__s1);
    apcStack_2688[0] = (code *)0x131e72;
    uVar8 = bson_as_canonical_extended_json(pcVar28);
    uVar19 = 0xffffffff;
    if (uStack_25fc != 0) {
      uVar22 = 0;
      do {
        if (*(int *)(pcVar28 + 4) == (int)uVar22) break;
        if (*(char *)((long)pvVar9 + uVar22) != *(char *)((long)pvVar11 + uVar22)) {
          uVar19 = uVar22 & 0xffffffff;
          break;
        }
        uVar22 = uVar22 + 1;
      } while (uStack_25fc != (uint)uVar22);
    }
    if ((int)uVar19 == -1) {
      uVar3 = uStack_25fc;
      if (uStack_25fc < *(uint *)(pcVar28 + 4)) {
        uVar3 = *(uint *)(pcVar28 + 4);
      }
      uVar19 = (ulong)(uVar3 - 1);
    }
    apcStack_2688[0] = (code *)0x131ecd;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,uVar5,uVar8);
    apcStack_2688[0] = (code *)0x131ee5;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    apcStack_2688[0] = (code *)0x131f00;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_2604 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_00131f56;
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131f5b;
    __n = (undefined1 *)(ulong)uStack_25fc;
    apcStack_2688[0] = (code *)0x131f2a;
    puVar13 = (undefined1 *)write(uVar3,pvVar9,(size_t)__n);
    if (puVar13 != __n) goto LAB_00131f60;
    pcVar28 = (char *)(ulong)*(uint *)(pcVar28 + 4);
    apcStack_2688[0] = (code *)0x131f40;
    pcVar21 = (char *)write(uVar4,pvVar11,(size_t)pcVar28);
    if (pcVar21 == pcVar28) {
      apcStack_2688[0] = (code *)0x131f51;
      test_bson_json_uescape_key_cold_4();
      goto LAB_00131f51;
    }
  }
  apcStack_2688[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_2a08 = (code *)0x131f98;
  pcStack_2690 = pcVar28;
  apcStack_2688[0] = (code *)apcStack_2288;
  cVar1 = bson_init_from_json(auStack_2a00,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_2918);
  if (cVar1 == '\0') {
    if (iStack_2918 != 1) goto LAB_00131fe4;
    if (iStack_2914 != 1) goto LAB_00131fe9;
    pcVar28 = acStack_2910;
    pcStack_2a08 = (code *)0x131fcb;
    pcVar21 = strstr(pcVar28,"UESCAPE_TOOSHORT");
    if (pcVar21 != (char *)0x0) {
      pcStack_2a08 = (code *)0x131fd8;
      bson_destroy(auStack_2a00);
      return;
    }
  }
  else {
    pcStack_2a08 = (code *)0x131fe4;
    test_bson_json_uescape_bad_cold_4();
LAB_00131fe4:
    pcStack_2a08 = (code *)0x131fe9;
    test_bson_json_uescape_bad_cold_1();
LAB_00131fe9:
    pcStack_2a08 = (code *)0x131fee;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_2a08 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_2e08 = (code *)0x132029;
  pcStack_2a10 = pcVar28;
  pcStack_2a08 = (code *)apcStack_2688;
  cVar1 = bson_init_from_json(acStack_2d80,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_2c98);
  if (cVar1 == '\0') {
LAB_0013221b:
    pcStack_2e08 = (code *)0x132228;
    test_bson_json_int32_cold_1();
LAB_00132228:
    pcStack_2e08 = (code *)0x132230;
    test_bson_json_int32_cold_4();
LAB_00132230:
    pcStack_2e08 = (code *)0x13223d;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_2e08 = (code *)0x132048;
    cVar1 = bson_iter_init_find(auStack_2e00,acStack_2d80,"x");
    if (cVar1 == '\0') {
      pcStack_2e08 = (code *)0x1321f8;
      test_bson_json_int32_cold_2();
LAB_001321f8:
      pcStack_2e08 = (code *)0x1321fd;
      test_bson_json_int32_cold_3();
LAB_001321fd:
      pcStack_2e08 = (code *)0x132202;
      test_bson_json_int32_cold_6();
LAB_00132202:
      pcStack_2e08 = (code *)0x132207;
      test_bson_json_int32_cold_7();
      pcStack_2e08 = (code *)0x13220c;
      test_bson_json_int32_cold_10();
      pcStack_2e08 = (code *)0x132211;
      test_bson_json_int32_cold_11();
      pcStack_2e08 = (code *)0x132216;
      test_bson_json_int32_cold_14();
      pcStack_2e08 = (code *)0x13221b;
      test_bson_json_int32_cold_15();
      goto LAB_0013221b;
    }
    pcStack_2e08 = (code *)0x132058;
    iVar2 = bson_iter_type(auStack_2e00);
    if (iVar2 != 0x10) goto LAB_001321f8;
    pcStack_2e08 = (code *)0x132069;
    iVar2 = bson_iter_int32(auStack_2e00);
    if (iVar2 != 0x7fffffff) goto LAB_00132228;
    pcVar28 = acStack_2d80;
    pcStack_2e08 = (code *)0x132084;
    bson_destroy(pcVar28);
    pcStack_2e08 = (code *)0x1320a2;
    cVar1 = bson_init_from_json(pcVar28,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_2c98);
    if (cVar1 == '\0') goto LAB_00132230;
    pcStack_2e08 = (code *)0x1320c1;
    cVar1 = bson_iter_init_find(auStack_2e00,acStack_2d80,"x");
    if (cVar1 == '\0') goto LAB_001321fd;
    pcStack_2e08 = (code *)0x1320d1;
    iVar2 = bson_iter_type(auStack_2e00);
    if (iVar2 != 0x10) goto LAB_00132202;
    pcStack_2e08 = (code *)0x1320e2;
    bson_iter_int32(auStack_2e00);
  }
  pcStack_2e08 = (code *)0x132245;
  test_bson_json_int32_cold_8();
  pcStack_2e08 = (code *)0x132252;
  test_bson_json_int32_cold_9();
  pcStack_2e08 = (code *)0x13225a;
  test_bson_json_int32_cold_12();
  pcStack_2e08 = (code *)0x132267;
  test_bson_json_int32_cold_13();
  pcStack_2e08 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_3208 = (code *)0x1322a4;
  pcStack_2e18 = pcVar28;
  pvStack_2e10 = pvVar11;
  pcStack_2e08 = (code *)&pcStack_2a08;
  cVar1 = bson_init_from_json(acStack_3180,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_30a0);
  if (cVar1 == '\0') {
LAB_0013253d:
    pcStack_3208 = (code *)0x13254a;
    test_bson_json_int64_cold_1();
LAB_0013254a:
    pcStack_3208 = (code *)0x132552;
    test_bson_json_int64_cold_4();
LAB_00132552:
    pcStack_3208 = (code *)0x13255f;
    test_bson_json_int64_cold_5();
LAB_0013255f:
    pcStack_3208 = (code *)0x132567;
    test_bson_json_int64_cold_8();
LAB_00132567:
    pcStack_3208 = (code *)0x13256c;
    test_bson_json_int64_cold_9();
LAB_0013256c:
    pcStack_3208 = (code *)0x132571;
    test_bson_json_int64_cold_10();
LAB_00132571:
    pcStack_3208 = (code *)0x132579;
    test_bson_json_int64_cold_23();
LAB_00132579:
    pcStack_3208 = (code *)0x13257e;
    test_bson_json_int64_cold_11();
LAB_0013257e:
    pcStack_3208 = (code *)0x132583;
    test_bson_json_int64_cold_12();
LAB_00132583:
    pcStack_3208 = (code *)0x13258b;
    test_bson_json_int64_cold_21();
LAB_0013258b:
    pcStack_3208 = (code *)0x132590;
    test_bson_json_int64_cold_13();
LAB_00132590:
    pcStack_3208 = (code *)0x132595;
    test_bson_json_int64_cold_14();
LAB_00132595:
    pcStack_3208 = (code *)0x13259d;
    test_bson_json_int64_cold_19();
LAB_0013259d:
    pcStack_3208 = (code *)0x1325a2;
    test_bson_json_int64_cold_15();
LAB_001325a2:
    pcStack_3208 = (code *)0x1325a7;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_3208 = (code *)0x1322c3;
    cVar1 = bson_iter_init_find(auStack_3200,acStack_3180,"x");
    if (cVar1 == '\0') {
      pcStack_3208 = (code *)0x13251a;
      test_bson_json_int64_cold_2();
LAB_0013251a:
      pcStack_3208 = (code *)0x13251f;
      test_bson_json_int64_cold_3();
LAB_0013251f:
      pcStack_3208 = (code *)0x132524;
      test_bson_json_int64_cold_6();
LAB_00132524:
      pcStack_3208 = (code *)0x132529;
      test_bson_json_int64_cold_7();
LAB_00132529:
      pcStack_3208 = (code *)0x13252e;
      test_bson_json_int64_cold_24();
LAB_0013252e:
      pcStack_3208 = (code *)0x132533;
      test_bson_json_int64_cold_22();
LAB_00132533:
      pcStack_3208 = (code *)0x132538;
      test_bson_json_int64_cold_20();
LAB_00132538:
      pcStack_3208 = (code *)0x13253d;
      test_bson_json_int64_cold_18();
      goto LAB_0013253d;
    }
    pcStack_3208 = (code *)0x1322d3;
    iVar2 = bson_iter_type(auStack_3200);
    if (iVar2 != 0x12) goto LAB_0013251a;
    pvVar11 = (void *)0x7fffffffffffffff;
    pcStack_3208 = (code *)0x1322ee;
    lVar6 = bson_iter_int64(auStack_3200);
    if (lVar6 != 0x7fffffffffffffff) goto LAB_0013254a;
    pcVar28 = acStack_3180;
    pcStack_3208 = (code *)0x132307;
    bson_destroy(pcVar28);
    pcStack_3208 = (code *)0x132325;
    cVar1 = bson_init_from_json(pcVar28,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_30a0);
    if (cVar1 == '\0') goto LAB_00132552;
    pcStack_3208 = (code *)0x132344;
    cVar1 = bson_iter_init_find(auStack_3200,acStack_3180,"x");
    if (cVar1 == '\0') goto LAB_0013251f;
    pcStack_3208 = (code *)0x132354;
    iVar2 = bson_iter_type(auStack_3200);
    if (iVar2 != 0x12) goto LAB_00132524;
    pcStack_3208 = (code *)0x132365;
    lVar6 = bson_iter_int64(auStack_3200);
    pvVar11 = (void *)0x8000000000000000;
    if (lVar6 != -0x8000000000000000) goto LAB_0013255f;
    pcVar28 = acStack_3180;
    pcStack_3208 = (code *)0x132381;
    bson_destroy(pcVar28);
    pcStack_3208 = (code *)0x13239f;
    cVar1 = bson_init_from_json(pcVar28,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_30a0);
    if (cVar1 != '\0') goto LAB_00132529;
    if (iStack_30a0 != 1) goto LAB_00132567;
    if (iStack_309c != 2) goto LAB_0013256c;
    pcVar28 = acStack_3098;
    pcStack_3208 = (code *)0x1323de;
    pcVar21 = strstr(pcVar28,"Number \"9223372036854775808\" is out of range");
    if (pcVar21 == (char *)0x0) goto LAB_00132571;
    pcStack_3208 = (code *)0x13240a;
    cVar1 = bson_init_from_json(acStack_3180,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_30a0);
    if (cVar1 != '\0') goto LAB_0013252e;
    if (iStack_30a0 != 1) goto LAB_00132579;
    if (iStack_309c != 2) goto LAB_0013257e;
    pcStack_3208 = (code *)0x132441;
    pcVar21 = strstr(pcVar28,"Number \"-9223372036854775809\" is out of range");
    if (pcVar21 == (char *)0x0) goto LAB_00132583;
    pcStack_3208 = (code *)0x13246d;
    cVar1 = bson_init_from_json(acStack_3180,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_30a0);
    if (cVar1 != '\0') goto LAB_00132533;
    if (iStack_30a0 != 1) goto LAB_0013258b;
    if (iStack_309c != 2) goto LAB_00132590;
    pcStack_3208 = (code *)0x1324a4;
    pcVar21 = strstr(pcVar28,"Number \"10000000000000000000\" is out of range");
    if (pcVar21 == (char *)0x0) goto LAB_00132595;
    pcStack_3208 = (code *)0x1324d0;
    cVar1 = bson_init_from_json(acStack_3180,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_30a0);
    if (cVar1 != '\0') goto LAB_00132538;
    if (iStack_30a0 != 1) goto LAB_0013259d;
    if (iStack_309c != 2) goto LAB_001325a2;
    pcStack_3208 = (code *)0x132503;
    pcVar21 = strstr(pcVar28,"Number \"-10000000000000000000\" is out of range");
    if (pcVar21 != (char *)0x0) {
      return;
    }
  }
  pcStack_3208 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_3608 = (code *)0x1325e2;
  pcStack_3210 = pcVar28;
  pcStack_3208 = (code *)&pcStack_2e08;
  cVar1 = bson_init_from_json(acStack_3580,"{ \"x\": 1 }",0xffffffffffffffff,auStack_3498);
  if (cVar1 == '\0') {
LAB_00132887:
    pcStack_3608 = (code *)0x132894;
    test_bson_json_double_cold_1();
LAB_00132894:
    pcStack_3608 = (code *)0x13289c;
    test_bson_json_double_cold_4();
LAB_0013289c:
    pcStack_3608 = (code *)0x1328a9;
    test_bson_json_double_cold_5();
LAB_001328a9:
    pcStack_3608 = (code *)0x1328b1;
    test_bson_json_double_cold_8();
LAB_001328b1:
    pcStack_3608 = (code *)0x1328be;
    test_bson_json_double_cold_9();
LAB_001328be:
    pcStack_3608 = (code *)0x1328c6;
    test_bson_json_double_cold_12();
LAB_001328c6:
    pcStack_3608 = (code *)0x1328d3;
    test_bson_json_double_cold_13();
LAB_001328d3:
    pcStack_3608 = (code *)0x1328db;
    test_bson_json_double_cold_16();
LAB_001328db:
    pcStack_3608 = (code *)0x1328e8;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_3608 = (code *)0x132601;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') {
      pcStack_3608 = (code *)0x132855;
      test_bson_json_double_cold_2();
LAB_00132855:
      pcStack_3608 = (code *)0x13285a;
      test_bson_json_double_cold_3();
LAB_0013285a:
      pcStack_3608 = (code *)0x13285f;
      test_bson_json_double_cold_6();
LAB_0013285f:
      pcStack_3608 = (code *)0x132864;
      test_bson_json_double_cold_7();
LAB_00132864:
      pcStack_3608 = (code *)0x132869;
      test_bson_json_double_cold_10();
LAB_00132869:
      pcStack_3608 = (code *)0x13286e;
      test_bson_json_double_cold_11();
LAB_0013286e:
      pcStack_3608 = (code *)0x132873;
      test_bson_json_double_cold_14();
LAB_00132873:
      pcStack_3608 = (code *)0x132878;
      test_bson_json_double_cold_15();
LAB_00132878:
      pcStack_3608 = (code *)0x13287d;
      test_bson_json_double_cold_18();
LAB_0013287d:
      pcStack_3608 = (code *)0x132882;
      test_bson_json_double_cold_19();
LAB_00132882:
      pcStack_3608 = (code *)0x132887;
      test_bson_json_double_cold_21();
      goto LAB_00132887;
    }
    pcStack_3608 = (code *)0x132611;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 0x10) goto LAB_00132855;
    pcStack_3608 = (code *)0x132622;
    iVar2 = bson_iter_int32(auStack_3600);
    if (iVar2 != 1) goto LAB_00132894;
    pcVar28 = acStack_3580;
    pcStack_3608 = (code *)0x13263b;
    bson_destroy(pcVar28);
    pcStack_3608 = (code *)0x132659;
    cVar1 = bson_init_from_json(pcVar28,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_3498);
    if (cVar1 == '\0') goto LAB_0013289c;
    pcStack_3608 = (code *)0x132678;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') goto LAB_0013285a;
    pcStack_3608 = (code *)0x132688;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 0x12) goto LAB_0013285f;
    pcStack_3608 = (code *)0x132699;
    lVar6 = bson_iter_int64(auStack_3600);
    if (lVar6 != 0x100000000) goto LAB_001328a9;
    pcVar28 = acStack_3580;
    pcStack_3608 = (code *)0x1326bc;
    bson_destroy(pcVar28);
    pcStack_3608 = (code *)0x1326da;
    cVar1 = bson_init_from_json(pcVar28,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_3498);
    if (cVar1 == '\0') goto LAB_001328b1;
    pcStack_3608 = (code *)0x1326f9;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') goto LAB_00132864;
    pcStack_3608 = (code *)0x132709;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 1) goto LAB_00132869;
    pcStack_3608 = (code *)0x13271a;
    dVar30 = (double)bson_iter_double(auStack_3600);
    if ((dVar30 != 1.0) || (NAN(dVar30))) goto LAB_001328be;
    pcVar28 = acStack_3580;
    pcStack_3608 = (code *)0x13273e;
    bson_destroy(pcVar28);
    pcStack_3608 = (code *)0x13275c;
    cVar1 = bson_init_from_json(pcVar28,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_3498);
    if (cVar1 == '\0') goto LAB_001328c6;
    pcStack_3608 = (code *)0x13277b;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') goto LAB_0013286e;
    pcStack_3608 = (code *)0x13278b;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 1) goto LAB_00132873;
    pcStack_3608 = (code *)0x13279c;
    dVar30 = (double)bson_iter_double(auStack_3600);
    if ((dVar30 != 0.0) || (NAN(dVar30))) goto LAB_001328d3;
    pcVar28 = acStack_3580;
    pcStack_3608 = (code *)0x1327c0;
    bson_destroy(pcVar28);
    pcStack_3608 = (code *)0x1327de;
    cVar1 = bson_init_from_json(pcVar28,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_3498);
    if (cVar1 == '\0') goto LAB_001328db;
    pcStack_3608 = (code *)0x1327fd;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') goto LAB_00132878;
    pcStack_3608 = (code *)0x132809;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 1) goto LAB_0013287d;
    pcStack_3608 = (code *)0x132816;
    dVar30 = (double)bson_iter_double(auStack_3600);
    if ((dVar30 == 0.0) && (!NAN(dVar30))) {
      pcStack_3608 = (code *)0x132832;
      bson_iter_double(auStack_3600);
      if (extraout_XMM0_Db < 0) {
        pcStack_3608 = (code *)0x132849;
        bson_destroy(acStack_3580);
        return;
      }
      goto LAB_00132882;
    }
  }
  pcStack_3608 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar21 = "2e400";
  ppuVar24 = &PTR_anon_var_dwarf_1affa_00161308;
  pcStack_3630 = pcVar28;
  puStack_3628 = __n;
  puStack_3620 = __s1;
  pvStack_3618 = pvVar11;
  pvStack_3610 = pvVar9;
  pcStack_3608 = (code *)&pcStack_3208;
  while( true ) {
    pcStack_3988 = (code *)0x13292e;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar21);
    pcStack_3988 = (code *)0x13294b;
    cVar1 = bson_init_from_json(auStack_3780,uVar5,0xffffffffffffffff,&iStack_3980);
    if (cVar1 != '\0') break;
    if (iStack_3980 != 1) goto LAB_00132a15;
    if (iStack_397c != 2) goto LAB_00132a10;
    pcStack_3988 = (code *)0x132979;
    pcVar28 = strstr(acStack_3978,"out of range");
    if (pcVar28 == (char *)0x0) goto LAB_00132a1a;
    pcStack_3988 = (code *)0x13298a;
    bson_free(uVar5);
    pcStack_3988 = (code *)0x13299b;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar21);
    pcStack_3988 = (code *)0x1329b8;
    cVar1 = bson_init_from_json(auStack_3780,uVar5,0xffffffffffffffff,&iStack_3980);
    if (cVar1 != '\0') goto LAB_00132a0b;
    if (iStack_3980 != 1) goto LAB_00132a29;
    if (iStack_397c != 2) goto LAB_00132a24;
    pcStack_3988 = (code *)0x1329da;
    pcVar28 = strstr(acStack_3978,"out of range");
    if (pcVar28 == (char *)0x0) goto LAB_00132a2e;
    pcStack_3988 = (code *)0x1329e7;
    bson_free(uVar5);
    pcVar21 = *ppuVar24;
    ppuVar24 = ppuVar24 + 1;
    if (pcVar21 == (char *)0x0) {
      return;
    }
  }
  pcStack_3988 = (code *)0x132a0b;
  test_bson_json_double_overflow_cold_8();
LAB_00132a0b:
  pcStack_3988 = (code *)0x132a10;
  test_bson_json_double_overflow_cold_6();
LAB_00132a10:
  pcStack_3988 = (code *)0x132a15;
  test_bson_json_double_overflow_cold_2();
LAB_00132a15:
  pcStack_3988 = (code *)0x132a1a;
  test_bson_json_double_overflow_cold_1();
LAB_00132a1a:
  pcStack_3988 = (code *)0x132a24;
  test_bson_json_double_overflow_cold_7();
LAB_00132a24:
  pcStack_3988 = (code *)0x132a29;
  test_bson_json_double_overflow_cold_4();
LAB_00132a29:
  pcStack_3988 = (code *)0x132a2e;
  test_bson_json_double_overflow_cold_3();
LAB_00132a2e:
  pcStack_3988 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_39a0 = "out of range";
  pcVar7 = "{ \"d\": NaN }";
  ppuVar27 = &PTR_anon_var_dwarf_1b04e_00161328;
  piVar20 = aiStack_3d00;
  piVar14 = &iStack_3c38;
  piVar29 = (int *)0x14a6f6;
  pcVar28 = (char *)&dStack_3d08;
  uStack_39b0 = uVar5;
  puStack_39a8 = (undefined1 *)&iStack_3980;
  pcStack_3998 = pcVar21;
  ppuStack_3990 = ppuVar24;
  pcStack_3988 = (code *)&pcStack_3608;
  do {
    apcStack_3d88[0] = (code *)0x132a8c;
    cVar1 = bson_init_from_json(piVar20,pcVar7,0xffffffffffffffff,piVar14);
    if (cVar1 == '\0') {
      apcStack_3d88[0] = (code *)0x132bf5;
      test_bson_json_nan_cold_1();
LAB_00132bf5:
      apcStack_3d88[0] = (code *)0x132bfa;
      test_bson_json_nan_cold_2();
LAB_00132bfa:
      apcStack_3d88[0] = (code *)0x132bff;
      test_bson_json_nan_cold_3();
      goto LAB_00132bff;
    }
    apcStack_3d88[0] = (code *)0x132a99;
    uVar5 = bson_bcone_magic();
    apcStack_3d88[0] = (code *)0x132ab4;
    cVar1 = bcon_extract(piVar20,"d",uVar5,1,pcVar28,0);
    if (cVar1 == '\0') goto LAB_00132bf5;
    if (!NAN(dStack_3d08) && !NAN(dStack_3d08)) goto LAB_00132bfa;
    apcStack_3d88[0] = (code *)0x132ad4;
    bson_destroy(piVar20);
    pcVar7 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar7 != (char *)0x0);
  pcVar21 = "{ \"d\": NaNn }";
  ppuVar27 = &PTR_anon_var_dwarf_1b07e_00161358;
  piVar20 = aiStack_3c30;
  piVar14 = aiStack_3d00;
  piVar29 = &iStack_3c38;
  pcVar28 = "Got parse error at";
  do {
    apcStack_3d88[0] = (code *)0x132b20;
    cVar1 = bson_init_from_json(piVar14,pcVar21,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') goto LAB_00132bff;
    if (iStack_3c38 != 1) goto LAB_00132c16;
    if (iStack_3c34 != 1) goto LAB_00132c09;
    apcStack_3d88[0] = (code *)0x132b53;
    pcVar21 = strstr((char *)piVar20,"Got parse error at");
    if (pcVar21 == (char *)0x0) goto LAB_00132c0e;
    pcVar21 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar21 != (char *)0x0);
  pcVar21 = "{ \"d\": nu";
  ppuVar27 = &PTR_anon_var_dwarf_1b0c6_00161398;
  piVar20 = aiStack_3c30;
  piVar14 = aiStack_3d00;
  piVar29 = &iStack_3c38;
  pcVar28 = "Incomplete JSON";
  while( true ) {
    apcStack_3d88[0] = (code *)0x132ba8;
    cVar1 = bson_init_from_json(piVar14,pcVar21,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') break;
    if (iStack_3c38 != 1) goto LAB_00132c28;
    if (iStack_3c34 != 1) goto LAB_00132c1b;
    apcStack_3d88[0] = (code *)0x132bcf;
    pcVar21 = strstr((char *)piVar20,"Incomplete JSON");
    if (pcVar21 == (char *)0x0) goto LAB_00132c20;
    pcVar21 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
    if (pcVar21 == (char *)0x0) {
      return;
    }
  }
LAB_00132c04:
  apcStack_3d88[0] = (code *)0x132c09;
  test_bson_json_nan_cold_9();
LAB_00132c09:
  apcStack_3d88[0] = (code *)0x132c0e;
  test_bson_json_nan_cold_5();
LAB_00132c0e:
  apcStack_3d88[0] = (code *)0x132c16;
  test_bson_json_nan_cold_10();
LAB_00132c16:
  apcStack_3d88[0] = (code *)0x132c1b;
  test_bson_json_nan_cold_4();
LAB_00132c1b:
  apcStack_3d88[0] = (code *)0x132c20;
  test_bson_json_nan_cold_7();
LAB_00132c20:
  apcStack_3d88[0] = (code *)0x132c28;
  test_bson_json_nan_cold_8();
LAB_00132c28:
  apcStack_3d88[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar21 = "{ \"d\": Infinity }";
  ppuVar24 = &PTR_anon_var_dwarf_1b13e_001613b8;
  piStack_3db0 = piVar20;
  pdStack_3da8 = (double *)pcVar28;
  ppuStack_3da0 = ppuVar27;
  piStack_3d98 = piVar14;
  piStack_3d90 = piVar29;
  apcStack_3d88[0] = (code *)&pcStack_3988;
  do {
    apcStack_4188[0] = (code *)0x132c81;
    cVar1 = bson_init_from_json(aiStack_4100,pcVar21,0xffffffffffffffff,&iStack_4038);
    if (cVar1 == '\0') {
      apcStack_4188[0] = (code *)0x132eb1;
      test_bson_json_infinity_cold_1();
LAB_00132eb1:
      apcStack_4188[0] = (code *)0x132eb6;
      test_bson_json_infinity_cold_2();
LAB_00132eb6:
      apcStack_4188[0] = (code *)0x132ebb;
      test_bson_json_infinity_cold_3();
      goto LAB_00132ebb;
    }
    apcStack_4188[0] = (code *)0x132c8e;
    uVar5 = bson_bcone_magic();
    apcStack_4188[0] = (code *)0x132ca9;
    cVar1 = bcon_extract(aiStack_4100,"d",uVar5,1,&dStack_4108,0);
    if (cVar1 == '\0') goto LAB_00132eb1;
    if ((NAN(dStack_4108)) || (!NAN(dStack_4108 - dStack_4108) && !NAN(dStack_4108 - dStack_4108)))
    goto LAB_00132eb6;
    apcStack_4188[0] = (code *)0x132cd7;
    bson_destroy(aiStack_4100);
    pcVar21 = *ppuVar24;
    ppuVar24 = ppuVar24 + 1;
  } while (pcVar21 != (char *)0x0);
  pcVar28 = "{ \"d\": -Infinity }";
  ppuVar24 = &PTR_anon_var_dwarf_1b162_001613d8;
  do {
    apcStack_4188[0] = (code *)0x132d20;
    cVar1 = bson_init_from_json(aiStack_4100,pcVar28,0xffffffffffffffff,&iStack_4038);
    if (cVar1 == '\0') goto LAB_00132ebb;
    apcStack_4188[0] = (code *)0x132d2d;
    uVar5 = bson_bcone_magic();
    apcStack_4188[0] = (code *)0x132d48;
    cVar1 = bcon_extract(aiStack_4100,"d",uVar5,1,&dStack_4108,0);
    if (cVar1 == '\0') goto LAB_00132ec0;
    if ((NAN(dStack_4108)) || (!NAN(dStack_4108 - dStack_4108))) goto LAB_00132ec5;
    if (0.0 <= dStack_4108) goto LAB_00132eca;
    apcStack_4188[0] = (code *)0x132d88;
    bson_destroy(aiStack_4100);
    pcVar28 = *ppuVar24;
    ppuVar24 = ppuVar24 + 1;
  } while (pcVar28 != (char *)0x0);
  pcVar21 = "{ \"d\": Infinityy }";
  ppuVar24 = &PTR_anon_var_dwarf_1b186_001613f8;
  piVar20 = aiStack_4030;
  piVar14 = aiStack_4100;
  piVar29 = &iStack_4038;
  pcVar28 = "Got parse error at";
  do {
    apcStack_4188[0] = (code *)0x132dd8;
    cVar1 = bson_init_from_json(piVar14,pcVar21,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') goto LAB_00132ecf;
    if (iStack_4038 != 1) goto LAB_00132ee6;
    if (iStack_4034 != 1) goto LAB_00132ed9;
    apcStack_4188[0] = (code *)0x132e0b;
    pcVar21 = strstr((char *)piVar20,"Got parse error at");
    if (pcVar21 == (char *)0x0) goto LAB_00132ede;
    pcVar21 = *ppuVar24;
    ppuVar24 = ppuVar24 + 1;
  } while (pcVar21 != (char *)0x0);
  pcVar21 = "{ \"d\": In";
  ppuVar24 = &PTR_anon_var_dwarf_1b1e6_00161448;
  piVar20 = aiStack_4030;
  piVar14 = aiStack_4100;
  piVar29 = &iStack_4038;
  pcVar28 = "Incomplete JSON";
  while( true ) {
    apcStack_4188[0] = (code *)0x132e60;
    cVar1 = bson_init_from_json(piVar14,pcVar21,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') break;
    if (iStack_4038 != 1) goto LAB_00132ef8;
    if (iStack_4034 != 1) goto LAB_00132eeb;
    apcStack_4188[0] = (code *)0x132e8b;
    pcVar21 = strstr((char *)piVar20,"Incomplete JSON");
    if (pcVar21 == (char *)0x0) goto LAB_00132ef0;
    pcVar21 = *ppuVar24;
    ppuVar24 = ppuVar24 + 1;
    if (pcVar21 == (char *)0x0) {
      return;
    }
  }
LAB_00132ed4:
  apcStack_4188[0] = (code *)0x132ed9;
  test_bson_json_infinity_cold_13();
LAB_00132ed9:
  apcStack_4188[0] = (code *)0x132ede;
  test_bson_json_infinity_cold_9();
LAB_00132ede:
  apcStack_4188[0] = (code *)0x132ee6;
  test_bson_json_infinity_cold_14();
LAB_00132ee6:
  apcStack_4188[0] = (code *)0x132eeb;
  test_bson_json_infinity_cold_8();
LAB_00132eeb:
  apcStack_4188[0] = (code *)0x132ef0;
  test_bson_json_infinity_cold_11();
LAB_00132ef0:
  apcStack_4188[0] = (code *)0x132ef8;
  test_bson_json_infinity_cold_12();
LAB_00132ef8:
  apcStack_4188[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_4508 = (code *)0x132f2a;
  apcStack_4188[0] = (code *)apcStack_3d88;
  cVar1 = bson_init_from_json(auStack_4500,"{ \"x\": null }",0xffffffffffffffff,auStack_4410);
  if (cVar1 == '\0') {
    pcStack_4508 = (code *)0x132f65;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_4508 = (code *)0x132f33;
    uVar5 = bson_bcone_magic();
    pcStack_4508 = (code *)0x132f4f;
    cVar1 = bcon_extract(auStack_4500,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_4508 = (code *)0x132f5b;
      bson_destroy(auStack_4500);
      return;
    }
  }
  pcStack_4508 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_4908 = (code *)0x0;
  pcStack_4910 = "}";
  acStack_4920[8] = -0x52;
  acStack_4920[9] = '/';
  acStack_4920[10] = '\x13';
  acStack_4920[0xb] = '\0';
  acStack_4920[0xc] = '\0';
  acStack_4920[0xd] = '\0';
  acStack_4920[0xe] = '\0';
  acStack_4920[0xf] = '\0';
  piStack_4530 = piVar20;
  pdStack_4528 = (double *)pcVar28;
  ppuStack_4520 = ppuVar24;
  piStack_4518 = piVar14;
  piStack_4510 = piVar29;
  pcStack_4508 = (code *)apcStack_4188;
  uVar19 = bcon_new(0,"a","{","b","{");
  uStack_4810 = 0;
  uStack_4808 = 0;
  uStack_4820 = 0;
  uStack_4818 = 0;
  uStack_4830 = 0;
  uStack_4828 = 0;
  uStack_4840 = 0;
  uStack_4838 = 0;
  uStack_4850 = 0;
  uStack_4848 = 0;
  uStack_4860 = 0;
  uStack_4858 = 0;
  uStack_4870 = 0;
  uStack_4868 = 0;
  uStack_4880 = (undefined *)0x500000003;
  uStack_4878 = 5;
  pcStack_4908 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&uStack_4880,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_47b8);
  if (cVar1 != '\0') {
    pcStack_4908 = (code *)0x133023;
    piVar29 = (int *)bson_get_data(&uStack_4880);
    pcStack_4908 = (code *)0x13302e;
    piVar14 = (int *)bson_get_data(uVar19);
    if (*(int *)(uVar19 + 4) == uStack_4880._4_4_) {
      pcStack_4908 = (code *)0x133043;
      pvVar9 = (void *)bson_get_data(uVar19);
      pcStack_4908 = (code *)0x133053;
      pvVar10 = (void *)bson_get_data(&uStack_4880);
      pcStack_4908 = (code *)0x133061;
      iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(uVar19 + 4));
      if (iVar2 == 0) {
        pcStack_4908 = (code *)0x133072;
        bson_destroy(&uStack_4880);
        pcStack_4908 = (code *)0x13307a;
        bson_destroy(uVar19);
        return;
      }
    }
    ppuVar24 = (undefined **)&uStack_4880;
    pcStack_4908 = (code *)0x13309b;
    uVar5 = bson_as_canonical_extended_json(ppuVar24);
    pcStack_4908 = (code *)0x1330a8;
    uVar8 = bson_as_canonical_extended_json(uVar19);
    uVar22 = 0xffffffff;
    if (uStack_4880._4_4_ != 0) {
      uVar23 = 0;
      do {
        if (*(int *)(uVar19 + 4) == (int)uVar23) break;
        if (*(char *)((long)piVar29 + uVar23) != *(char *)((long)piVar14 + uVar23)) {
          uVar22 = uVar23 & 0xffffffff;
          break;
        }
        uVar23 = uVar23 + 1;
      } while (uStack_4880._4_4_ != (uint)uVar23);
    }
    if ((int)uVar22 == -1) {
      uVar3 = uStack_4880._4_4_;
      if (uStack_4880._4_4_ < *(uint *)(uVar19 + 4)) {
        uVar3 = *(uint *)(uVar19 + 4);
      }
      uVar22 = (ulong)(uVar3 - 1);
    }
    pcStack_4908 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar22,uVar5,uVar8);
    pcStack_4908 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar28 = (char *)(ulong)uVar3;
    pcStack_4908 = (code *)0x133136;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_4884 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_4908 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_4908 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_4908 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      ppuVar24 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013318c;
      pcVar28 = (char *)((ulong)uStack_4880 >> 0x20);
      pcStack_4908 = (code *)0x133160;
      pdVar15 = (double *)write(uVar3,piVar29,(size_t)pcVar28);
      if (pdVar15 != (double *)pcVar28) goto LAB_00133191;
      uVar19 = (ulong)*(uint *)(uVar19 + 4);
      pcStack_4908 = (code *)0x133176;
      uVar22 = write(uVar4,piVar14,uVar19);
      if (uVar22 == uVar19) {
        pcStack_4908 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_4908 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_4908 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar21 = acStack_4920;
  acStack_4920[8] = '\0';
  acStack_4920[9] = '\0';
  acStack_4920[10] = '\0';
  acStack_4920[0xb] = '\0';
  acStack_4920[0xc] = '\0';
  acStack_4920[0xd] = '\0';
  acStack_4920[0xe] = '@';
  acStack_4920[0xf] = '0';
  acStack_4920[0] = '\v';
  acStack_4920[1] = '\0';
  acStack_4920[2] = '\0';
  acStack_4920[3] = '\0';
  acStack_4920[4] = '\0';
  acStack_4920[5] = '\0';
  acStack_4920[6] = '\0';
  acStack_4920[7] = '\0';
  pcStack_4930 = (code *)0x1331ce;
  pcStack_4910 = (char *)uVar19;
  pcStack_4908 = (code *)piVar14;
  plVar16 = (long *)bson_new();
  pcStack_4930 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar16,"decimal128",0xffffffff,pcVar21);
  if (cVar1 == '\0') {
    pcStack_4930 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_4930 = (code *)0x1331f7;
    pcVar21 = (char *)bson_as_json(plVar16,auStack_4928);
    if (pcVar21 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_4930 = (code *)0x133221;
      bson_free(pcVar21);
      pcStack_4930 = (code *)0x133229;
      bson_destroy(plVar16);
      return;
    }
    pcStack_4930 = (code *)0x133215;
    iVar2 = strcmp(pcVar21,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_4930 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar31 = &pcStack_4930;
  pcStack_4d88 = (code *)0x133271;
  plStack_4938 = plVar16;
  pcStack_4930 = (code *)&pcStack_4508;
  cVar1 = bson_init_from_json(auStack_4c80,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_4b98);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_4d88 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_4d00,auStack_4c80);
  if (cVar1 == '\0') {
    pcStack_4d88 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_4d88 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_4d88 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_4d88 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_4d88 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_4d00,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_4d88 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_4d00);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar16 = &lStack_4d10;
    pcStack_4d88 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_4d00,plVar16);
    if (lStack_4d10 != 0xb) goto LAB_0013330b;
    if (lStack_4d08 == 0x3040000000000000) {
      pcStack_4d88 = (code *)0x1332f5;
      bson_destroy(auStack_4c80);
      return;
    }
  }
  pcStack_4d88 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_4d88 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar7 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar27 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_4da0 = plVar16;
  pdStack_4d98 = (double *)pcVar28;
  pcStack_4d90 = pcVar21;
  pcStack_4d88 = (code *)piVar29;
  do {
    pcStack_4fb0 = (code *)0x133357;
    lVar6 = bson_new_from_json(pcVar7,0xffffffffffffffff,&iStack_4fa0);
    if (lVar6 != 0) {
      pcStack_4fb0 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_4fb0 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_4f98,
              piVar29);
      pcStack_4fb0 = (code *)0x1333c7;
      abort();
    }
    if (iStack_4fa0 != 1) {
LAB_001333cc:
      pcStack_4fb0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_51c8 = (code *)0x1333f1;
      pcStack_4fb8 = acStack_4f98;
      pcStack_4fb0 = (code *)&iStack_4fa0;
      pcVar28 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_51b8);
      pcStack_51c8 = (code *)0x1333fe;
      pcVar21 = (char *)bson_as_json(pcVar28,0);
      if (pcVar21 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_51c8 = (code *)0x133428;
        bson_free(pcVar21);
        pcStack_51c8 = (code *)0x133430;
        bson_destroy(pcVar28);
        return;
      }
      pcStack_51c8 = (code *)0x13341c;
      iVar2 = strcmp(pcVar21,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_51c8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_53d8 = 0x2200223a2261227b;
      uStack_53d0 = 0x7d;
      uStack_53dc = 0x227b;
      pcStack_51c8 = (code *)pcVar28;
      lVar6 = bson_new_from_json(&uStack_53d8,9,&iStack_53c8);
      if (lVar6 == 0) {
        if (iStack_53c8 != 1) goto LAB_001334fc;
        if (iStack_53c4 != 1) goto LAB_00133501;
        pcVar28 = acStack_53c0;
        pcVar7 = strstr(pcVar28,"Got parse error");
        if (pcVar7 == (char *)0x0) goto LAB_00133506;
        lVar6 = bson_new_from_json(&uStack_53dc,3,&iStack_53c8);
        if (lVar6 != 0) goto LAB_001334f7;
        if (iStack_53c8 != 1) goto LAB_0013350e;
        if (iStack_53c4 == 1) {
          pcVar7 = strstr(pcVar28,"Got parse error");
          if (pcVar7 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar8 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0,uVar5,pcVar28,ppuVar27,ppuVar24,pcVar21,piVar29,ppcVar31)
      ;
      uVar17 = bcon_new(0,"b",uVar8,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar17,0);
      uVar5 = bson_new();
      uVar17 = bson_new();
      uVar18 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar17,uVar18,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,"b",uVar8,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar8,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar8,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_4f9c != 2) {
      pcStack_4fb0 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    piVar29 = (int *)ppuVar27[-1];
    pcStack_4fb0 = (code *)0x13337e;
    pcVar28 = strstr(acStack_4f98,(char *)piVar29);
    if (pcVar28 == (char *)0x0) goto LAB_001333a4;
    pcVar7 = *ppuVar27;
    ppuVar27 = ppuVar27 + 2;
    if (pcVar7 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00132bff:
  apcStack_3d88[0] = (code *)0x132c04;
  test_bson_json_nan_cold_11();
  goto LAB_00132c04;
LAB_00132ebb:
  apcStack_4188[0] = (code *)0x132ec0;
  test_bson_json_infinity_cold_4();
LAB_00132ec0:
  apcStack_4188[0] = (code *)0x132ec5;
  test_bson_json_infinity_cold_5();
LAB_00132ec5:
  apcStack_4188[0] = (code *)0x132eca;
  test_bson_json_infinity_cold_6();
LAB_00132eca:
  piVar14 = &iStack_4038;
  pcVar28 = (char *)&dStack_4108;
  piVar20 = aiStack_4100;
  piVar29 = (int *)0x14a6f6;
  apcStack_4188[0] = (code *)0x132ecf;
  test_bson_json_infinity_cold_7();
LAB_00132ecf:
  apcStack_4188[0] = (code *)0x132ed4;
  test_bson_json_infinity_cold_15();
  goto LAB_00132ed4;
}

Assistant:

static void
test_bson_json_read_legacy_binary (void)
{
   const char *jsons[] = {"{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}",
                          "{\"x\": {\"$type\": \"05\", \"$binary\": \"Zm9v\"}}",
                          NULL};

   const char **json;
   bson_error_t error;
   bson_t b;
   bool r;
   bson_subtype_t subtype;
   uint32_t len;
   const uint8_t *binary;

   for (json = jsons; *json; json++) {
      r = bson_init_from_json (&b, *json, -1, &error);

      ASSERT_OR_PRINT (r, error);
      BCON_EXTRACT (&b, "x", BCONE_BIN (subtype, binary, len));
      ASSERT_CMPINT ((int) subtype, ==, 5);
      ASSERT_CMPUINT32 (len, ==, (uint32_t) 3);
      ASSERT_CMPSTR ((const char *) binary, "foo");

      bson_destroy (&b);
   }
}